

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebgodunov_plm.cpp
# Opt level: O3

void EBPLM::PredictVelOnZFace
               (Box *zebox,Array4<double> *Imz,Array4<double> *Ipz,Array4<const_double> *q,
               Array4<const_double> *ccvel,Array4<const_amrex::EBCellFlag> *flag,
               Array4<const_double> *vfrac,Array4<const_double> *fcx,Array4<const_double> *fcy,
               Array4<const_double> *fcz,Array4<const_double> *ccc,Geometry *geom,Real dt,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *pbc)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  BCRec *bcrec;
  long lVar29;
  double *pdVar30;
  double *pdVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  double *pdVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  double *pdVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  double *pdVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  EBCellFlag *pEVar47;
  long lVar48;
  long lVar49;
  double *pdVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  double *pdVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  double *pdVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  double *pdVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  undefined8 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  int iVar80;
  pair<bool,_bool> pVar81;
  pair<bool,_bool> pVar82;
  pair<bool,_bool> pVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  uint uVar89;
  long lVar90;
  long lVar91;
  long lVar92;
  long lVar93;
  long lVar94;
  long lVar95;
  long lVar96;
  long lVar97;
  long lVar98;
  long lVar99;
  long lVar100;
  long lVar101;
  long lVar102;
  long lVar103;
  long lVar104;
  long lVar105;
  long lVar106;
  long lVar107;
  long lVar108;
  long lVar109;
  long lVar110;
  long lVar111;
  long lVar112;
  ulong uVar113;
  long lVar114;
  long lVar115;
  long lVar116;
  long lVar117;
  long lVar118;
  long lVar119;
  long lVar120;
  long lVar121;
  long lVar122;
  long lVar123;
  long lVar124;
  long lVar125;
  long lVar126;
  Long *pLVar127;
  long lVar128;
  int iVar129;
  uint uVar130;
  ulong uVar131;
  long lVar132;
  long lVar133;
  long lVar134;
  long lVar135;
  int dir;
  int dir_00;
  int iVar136;
  int iVar137;
  long lVar138;
  double **ppdVar139;
  int iVar140;
  int iVar141;
  long lVar142;
  long lVar143;
  int iVar144;
  long lVar145;
  long lVar146;
  long lVar147;
  long lVar148;
  long lVar149;
  char cVar150;
  int iVar151;
  long lVar152;
  long lVar153;
  int kk_1;
  int iVar154;
  uint uVar155;
  long lVar156;
  long lVar157;
  double *pdVar158;
  double *pdVar159;
  char cVar160;
  int iVar161;
  long lVar162;
  long lVar163;
  long lVar164;
  double *pdVar165;
  double *pdVar166;
  double *pdVar167;
  int iVar168;
  int iVar169;
  long lVar170;
  long lVar171;
  long lVar172;
  long lVar173;
  bool bVar174;
  int iVar175;
  long lVar176;
  long lVar177;
  double *pdVar178;
  double *pdVar179;
  int iVar180;
  int iVar181;
  long lVar182;
  long lVar183;
  bool bVar184;
  ulong uVar185;
  double dVar186;
  double dVar187;
  double dVar188;
  ulong uVar189;
  double dVar190;
  double dVar191;
  double dVar192;
  double dVar194;
  undefined1 auVar193 [16];
  double dVar195;
  double dVar196;
  double dVar199;
  double dVar200;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  double dVar201;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  double dVar204;
  double dVar205;
  ulong uVar206;
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  double dVar215;
  double dVar216;
  Real delta_y;
  Real delta_x;
  Real du [27];
  Real A [27] [3];
  double local_918;
  long local_8a8;
  double *local_830;
  double *local_750;
  double *local_748;
  double adStack_3b8 [28];
  anon_class_680_18_41abcaaf local_2d8;
  
  dVar186 = dt / (geom->super_CoordSys).dx[2];
  iVar175 = (geom->domain).smallend.vect[0];
  iVar181 = (geom->domain).smallend.vect[1];
  iVar168 = (geom->domain).bigend.vect[0];
  iVar3 = (geom->domain).bigend.vect[1];
  iVar4 = (geom->domain).smallend.vect[2];
  iVar5 = (geom->domain).bigend.vect[2];
  bcrec = (h_bcrec->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
          super__Vector_impl_data._M_start;
  pVar81 = anon_unknown.dwarf_632572::has_extdir_or_ho(bcrec,0,iVar181);
  pVar82 = anon_unknown.dwarf_632572::has_extdir_or_ho(bcrec,1,dir);
  pVar83 = anon_unknown.dwarf_632572::has_extdir_or_ho(bcrec,2,dir_00);
  if ((((ushort)pVar81 & 1) == 0) || (iVar175 < (zebox->smallend).vect[0] + -1)) {
    iVar6 = (zebox->bigend).vect[0];
    if ((((iVar6 < iVar168 || ((ushort)pVar81 >> 8 & 1) == 0) &&
         ((((ushort)pVar83 & 1) == 0 || (iVar4 < (zebox->smallend).vect[2] + -1)))) &&
        ((((ushort)pVar83 >> 8 & 1) == 0 || ((zebox->bigend).vect[2] < iVar5)))) &&
       (((((ushort)pVar82 & 1) == 0 || (iVar181 < (zebox->smallend).vect[1] + -1)) &&
        ((((ushort)pVar82 >> 8 & 1) == 0 || ((zebox->bigend).vect[1] < iVar3)))))) {
      lVar29 = ccc->nstride;
      iVar175 = (ccc->begin).x;
      lVar90 = (long)iVar175;
      pdVar30 = ccc->p;
      iVar181 = (q->begin).x;
      lVar156 = (long)iVar181;
      iVar168 = (zebox->smallend).vect[0];
      lVar142 = (long)iVar168;
      pdVar31 = q->p;
      lVar32 = q->jstride;
      lVar33 = q->kstride;
      lVar34 = q->nstride;
      iVar3 = (q->begin).y;
      uVar131 = (ulong)iVar3;
      iVar4 = (q->begin).z;
      lVar91 = (long)iVar4;
      pdVar35 = ccvel->p;
      lVar36 = ccvel->jstride;
      lVar37 = ccvel->kstride;
      lVar38 = ccvel->nstride;
      lVar162 = (long)(ccvel->begin).x;
      iVar5 = (ccvel->begin).y;
      lVar163 = (long)(ccvel->begin).z;
      pdVar39 = Imz->p;
      lVar40 = Imz->jstride;
      lVar41 = Imz->kstride;
      lVar42 = Imz->nstride;
      iVar6 = (Imz->begin).x;
      iVar7 = (Imz->begin).y;
      iVar8 = (Imz->begin).z;
      pdVar43 = Ipz->p;
      lVar44 = Ipz->jstride;
      lVar45 = Ipz->kstride;
      lVar46 = Ipz->nstride;
      iVar9 = (Ipz->begin).x;
      iVar10 = (Ipz->begin).y;
      uVar11 = (Ipz->begin).z;
      pEVar47 = flag->p;
      lVar48 = flag->jstride;
      lVar49 = flag->kstride;
      iVar12 = (flag->begin).x;
      iVar141 = (flag->begin).y;
      lVar176 = (long)(flag->begin).z;
      pdVar50 = vfrac->p;
      lVar51 = vfrac->jstride;
      lVar52 = vfrac->kstride;
      uVar13 = (vfrac->begin).x;
      lVar177 = (long)(int)uVar13;
      uVar14 = (vfrac->begin).y;
      lVar92 = (long)(int)uVar14;
      iVar15 = (vfrac->begin).z;
      lVar182 = (long)iVar15;
      lVar53 = ccc->jstride;
      lVar54 = ccc->kstride;
      iVar16 = (ccc->begin).y;
      iVar17 = (ccc->begin).z;
      pdVar55 = fcx->p;
      lVar56 = fcx->jstride;
      lVar57 = fcx->kstride;
      lVar58 = fcx->nstride;
      iVar18 = (fcx->begin).x;
      iVar19 = (fcx->begin).y;
      lVar170 = (long)(fcx->begin).z;
      pdVar59 = fcy->p;
      lVar60 = fcy->jstride;
      lVar61 = fcy->kstride;
      lVar62 = fcy->nstride;
      lVar171 = (long)(fcy->begin).x;
      iVar20 = (fcy->begin).y;
      lVar172 = (long)(fcy->begin).z;
      pdVar63 = fcz->p;
      lVar64 = fcz->jstride;
      lVar65 = fcz->kstride;
      lVar66 = fcz->nstride;
      lVar173 = (long)(fcz->begin).x;
      iVar21 = (fcz->begin).y;
      iVar22 = (fcz->begin).z;
      iVar23 = (zebox->smallend).vect[1];
      iVar24 = (zebox->smallend).vect[2];
      iVar25 = (zebox->bigend).vect[0];
      iVar26 = (zebox->bigend).vect[1];
      iVar27 = (zebox->bigend).vect[2];
      local_830 = pdVar31 + ((lVar142 + -1) - lVar156);
      local_8a8 = 0;
      do {
        if (iVar24 <= iVar27) {
          lVar132 = local_8a8 * lVar34;
          lVar128 = (long)iVar24;
          do {
            if (iVar23 <= iVar26) {
              lVar2 = lVar128 + -1;
              lVar183 = lVar128 + -2;
              lVar107 = lVar128 + 1;
              lVar93 = (lVar128 - lVar182) * lVar52;
              lVar94 = (lVar2 - lVar182) * lVar52;
              lVar95 = (lVar183 - lVar182) * lVar52;
              lVar96 = (lVar107 - lVar182) * lVar52;
              lVar97 = (lVar128 - lVar91) * lVar33;
              lVar98 = (lVar128 - lVar163) * lVar37;
              lVar99 = (lVar2 - lVar91) * lVar33;
              lVar100 = (lVar107 - lVar91) * lVar33;
              lVar101 = (lVar183 - lVar91) * lVar33;
              lVar102 = (lVar128 - iVar22) * lVar65;
              lVar103 = (lVar128 - iVar17) * lVar54;
              iVar144 = (int)lVar128;
              iVar84 = iVar144 - iVar4;
              lVar104 = iVar84 * lVar33;
              lVar105 = (lVar128 - lVar172) * lVar61;
              lVar106 = (lVar128 - lVar170) * lVar57;
              iVar154 = (int)lVar107;
              lVar107 = (iVar154 - iVar15) * lVar52;
              lVar108 = ((int)lVar183 - iVar15) * lVar52;
              lVar133 = ((int)lVar183 - iVar4) * lVar33;
              iVar85 = (int)lVar2 - iVar17;
              iVar86 = (int)lVar2 - iVar4;
              lVar109 = iVar86 * lVar33;
              lVar110 = (lVar2 - lVar172) * lVar61;
              lVar111 = (lVar2 - lVar170) * lVar57;
              lVar152 = (lVar2 - lVar163) * lVar37;
              lVar112 = (~(long)iVar17 + lVar128) * lVar54;
              lVar183 = (long)iVar23;
              do {
                if (iVar25 < iVar168) {
                  uVar113 = lVar183 + 1U & 0xffffffff;
                }
                else {
                  lVar114 = (lVar183 - iVar141) * lVar48;
                  lVar115 = (lVar183 - lVar92) * lVar51;
                  lVar116 = (lVar183 - uVar131) * lVar32;
                  lVar117 = (lVar183 - iVar5) * lVar36;
                  lVar118 = (lVar183 - iVar21) * lVar64;
                  lVar119 = (lVar183 - iVar16) * lVar53;
                  iVar180 = (int)lVar183;
                  iVar87 = iVar180 - iVar3;
                  lVar120 = iVar87 * lVar32;
                  lVar121 = ((lVar183 + -1) - lVar92) * lVar51;
                  uVar113 = lVar183 + 1;
                  lVar138 = (uVar113 - lVar92) * lVar51;
                  lVar145 = ((lVar183 + -1) - uVar131) * lVar32;
                  lVar147 = (uVar113 - uVar131) * lVar32;
                  lVar149 = ((int)uVar113 - iVar20) * lVar60;
                  lVar153 = (lVar183 - iVar20) * lVar60;
                  lVar157 = (lVar183 - iVar19) * lVar56;
                  lVar164 = (int)(~uVar14 + iVar180) * lVar51;
                  lVar143 = (int)((int)uVar113 - uVar14) * lVar51;
                  lVar122 = (~(long)iVar16 + lVar183) * lVar53;
                  lVar134 = lVar142 + lVar112 + lVar122;
                  pdVar165 = pdVar30 + ((lVar122 + lVar112 + lVar29 + lVar142 + -1) - lVar90);
                  local_748 = pdVar30 + ((lVar29 * 2 + lVar134 + -1) - lVar90);
                  local_750 = pdVar30 + ((lVar134 + -1) - lVar90);
                  lVar134 = (long)local_830 +
                            (lVar183 + ~uVar131) * lVar32 * 8 +
                            (lVar128 + (-2 - lVar91)) * lVar33 * 8;
                  lVar122 = lVar142;
                  iVar140 = (iVar168 + -1) - iVar181;
                  iVar80 = (iVar168 + -1) - iVar175;
                  do {
                    lVar123 = lVar122 - iVar12;
                    uVar28 = pEVar47[lVar114 + lVar123 + (lVar128 - lVar176) * lVar49].flag;
                    dVar187 = 0.0;
                    dVar190 = 0.0;
                    if ((uVar28 >> 9 & 1) != 0) {
                      lVar135 = lVar122 - lVar177;
                      dVar201 = pdVar50[lVar115 + lVar135 + lVar93];
                      iVar88 = (int)lVar122;
                      if ((((dVar201 != 1.0) || (NAN(dVar201))) ||
                          (pdVar50[lVar115 + lVar135 + lVar94] != 1.0)) ||
                         (NAN(pdVar50[lVar115 + lVar135 + lVar94]))) {
LAB_003194a7:
                        lVar124 = lVar122 - lVar173;
                        dVar190 = pdVar63[lVar118 + lVar124 + lVar102];
                        dVar204 = (pdVar63 + lVar118 + lVar124 + lVar102)[lVar66];
                        lVar125 = lVar122 - lVar90;
                        dVar211 = pdVar30[lVar103 + lVar119 + lVar125 + lVar29 * 2];
                        dVar192 = pdVar30[lVar103 + lVar119 + lVar125];
                        dVar191 = pdVar30[lVar103 + lVar119 + lVar125 + lVar29];
                        lVar125 = (long)(iVar88 - iVar181);
                        dVar196 = pdVar31[lVar120 + lVar125 + lVar104 + lVar132];
                        dVar216 = pdVar31[lVar120 + lVar125 + lVar99 + lVar132];
                        lVar146 = -1;
                        cVar150 = '\x05';
                        lVar126 = 0;
                        pdVar158 = local_750;
                        pdVar166 = pdVar165;
                        pdVar178 = local_748;
                        do {
                          lVar148 = -1;
                          pdVar159 = pdVar158;
                          pdVar167 = pdVar166;
                          pdVar179 = pdVar178;
                          cVar160 = cVar150;
                          do {
                            iVar137 = (int)lVar126;
                            ppdVar139 = &local_2d8.q.p + (long)iVar137 * 3;
                            lVar126 = 0;
                            do {
                              iVar129 = (int)lVar126 + -1;
                              if ((((int)lVar148 == 0 && (int)lVar146 == 0) && iVar129 == 0) ||
                                 ((1 << (cVar160 + (char)lVar126 & 0x1fU) & uVar28) == 0)) {
                                *ppdVar139 = (double *)0x0;
                                ppdVar139[1] = (double *)0x0;
                                ppdVar139[2] = (double *)0x0;
                              }
                              else {
                                dVar187 = pdVar167[lVar126];
                                *ppdVar139 = (double *)
                                             ((pdVar159[lVar126] + (double)iVar129) - dVar192);
                                ppdVar139[1] = (double *)
                                               ((dVar187 + (double)(int)lVar148) - dVar191);
                                ppdVar139[2] = (double *)
                                               ((pdVar179[lVar126] + (double)(int)lVar146) - dVar211
                                               );
                              }
                              lVar126 = lVar126 + 1;
                              ppdVar139 = ppdVar139 + 3;
                            } while (lVar126 != 3);
                            lVar148 = lVar148 + 1;
                            pdVar179 = pdVar179 + lVar53;
                            pdVar167 = pdVar167 + lVar53;
                            pdVar159 = pdVar159 + lVar53;
                            cVar160 = cVar160 + '\x03';
                            lVar126 = (long)iVar137 + 3;
                          } while (lVar148 != 2);
                          lVar146 = lVar146 + 1;
                          pdVar178 = pdVar178 + lVar54;
                          pdVar166 = pdVar166 + lVar54;
                          pdVar158 = pdVar158 + lVar54;
                          cVar150 = cVar150 + '\t';
                          lVar126 = (long)iVar137 + 3;
                        } while (lVar146 != 2);
                        lVar146 = -1;
                        cVar150 = '\x05';
                        lVar126 = 0;
                        do {
                          lVar148 = -1;
                          cVar160 = cVar150;
                          do {
                            iVar137 = (int)lVar126;
                            lVar126 = 0;
                            do {
                              dVar187 = 0.0;
                              if (((int)lVar126 != 1 || ((int)lVar148 != 0 || (int)lVar146 != 0)) &&
                                 ((1 << (cVar160 + (char)lVar126 & 0x1fU) & uVar28) != 0)) {
                                dVar187 = pdVar31[lVar132 + (iVar84 + (int)lVar146) * lVar33 +
                                                            (iVar87 + (int)lVar148) * lVar32 +
                                                            (long)(iVar140 + (int)lVar126)] -
                                          dVar196;
                              }
                              adStack_3b8[iVar137 + lVar126] = dVar187;
                              lVar126 = lVar126 + 1;
                            } while (lVar126 != 3);
                            lVar148 = lVar148 + 1;
                            cVar160 = cVar160 + '\x03';
                            lVar126 = (long)iVar137 + 3;
                          } while (lVar148 != 2);
                          lVar146 = lVar146 + 1;
                          cVar150 = cVar150 + '\t';
                          lVar126 = (long)iVar137 + 3;
                        } while (lVar146 != 2);
                        dVar204 = dVar204 - dVar191;
                        dVar195 = 0.0;
                        dVar199 = 0.0;
                        dVar209 = 0.0;
                        pLVar127 = &local_2d8.q.kstride;
                        lVar126 = 0;
                        dVar187 = 0.0;
                        dVar194 = 0.0;
                        dVar212 = 0.0;
                        dVar213 = 0.0;
                        dVar205 = 0.0;
                        dVar207 = 0.0;
                        do {
                          pdVar158 = ((Array4<const_double> *)(pLVar127 + -2))->p;
                          dVar208 = (double)pLVar127[-1];
                          dVar188 = (double)*pLVar127;
                          dVar200 = adStack_3b8[lVar126];
                          dVar205 = dVar205 + dVar208 * (double)pLVar127[-1];
                          dVar207 = dVar207 + (double)pdVar158 * (double)*pLVar127;
                          dVar209 = dVar209 + dVar188 * dVar188;
                          dVar212 = dVar212 + dVar200 * (double)pdVar158;
                          dVar213 = dVar213 + (double)pdVar158 * (double)pdVar158;
                          dVar195 = dVar195 + dVar200 * dVar208;
                          dVar199 = dVar199 + dVar208 * (double)pdVar158;
                          dVar187 = dVar187 + dVar188 * (double)pLVar127[-1];
                          dVar194 = dVar194 + dVar200 * (double)*pLVar127;
                          lVar126 = lVar126 + 1;
                          pLVar127 = pLVar127 + 3;
                        } while (lVar126 != 0x1b);
                        dVar188 = dVar199 * dVar209 - dVar207 * dVar187;
                        dVar200 = dVar199 * dVar194 - dVar207 * dVar195;
                        dVar208 = dVar199 * dVar187 + dVar207 * -dVar205;
                        dVar210 = dVar209 * dVar205 - dVar187 * dVar187;
                        dVar209 = dVar209 * dVar195 - dVar187 * dVar194;
                        auVar202._0_8_ =
                             dVar207 * (dVar195 * dVar187 - dVar194 * dVar205) +
                             (dVar212 * dVar210 - dVar209 * dVar199);
                        auVar202._8_8_ = dVar207 * dVar200 + (dVar213 * dVar209 - dVar188 * dVar212)
                        ;
                        dVar207 = dVar208 * dVar207 + (dVar210 * dVar213 - dVar188 * dVar199);
                        auVar203._8_8_ = dVar207;
                        auVar203._0_8_ = dVar207;
                        auVar203 = divpd(auVar202,auVar203);
                        dVar207 = (dVar208 * dVar212 +
                                  ((dVar194 * dVar205 + -dVar195 * dVar187) * dVar213 -
                                  dVar200 * dVar199)) / dVar207;
                        dVar194 = auVar203._0_8_;
                        dVar195 = auVar203._8_8_;
                        if ((dVar201 == 1.0) && (!NAN(dVar201))) {
                          if ((pdVar50[lVar115 + lVar93 + ((lVar122 + -1) - lVar177)] == 1.0) &&
                             (!NAN(pdVar50[lVar115 + lVar93 + ((lVar122 + -1) - lVar177)]))) {
                            if ((pdVar50[lVar115 + lVar93 + ((lVar122 + 1) - lVar177)] == 1.0) &&
                               (!NAN(pdVar50[lVar115 + lVar93 + ((lVar122 + 1) - lVar177)]))) {
                              dVar205 = dVar196 - pdVar31[lVar120 + lVar104 + lVar132 + ((lVar122 +
                                                                                         -1) - 
                                                  lVar156)];
                              dVar209 = pdVar31[lVar120 + lVar104 + lVar132 + ((lVar122 + 1) -
                                                                              lVar156)] - dVar196;
                              dVar205 = dVar205 + dVar205;
                              dVar209 = dVar209 + dVar209;
                              dVar187 = (pdVar31[lVar120 + lVar104 + lVar132 + ((lVar122 + 1) -
                                                                               lVar156)] -
                                        pdVar31[lVar120 + lVar104 + lVar132 + ((lVar122 + -1) -
                                                                              lVar156)]) * 0.5;
                              dVar199 = ABS(dVar205);
                              uVar185 = -(ulong)(0.0 < dVar187);
                              dVar187 = ABS(dVar187);
                              dVar194 = ABS(dVar209);
                              if (dVar199 <= dVar187) {
                                dVar187 = dVar199;
                              }
                              if (dVar187 <= dVar194) {
                                dVar194 = dVar187;
                              }
                              uVar189 = -(ulong)(0.0 < dVar205 * dVar209) & (ulong)dVar194;
                              dVar194 = (double)(~uVar185 & (uVar189 ^ 0x8000000000000000) |
                                                uVar185 & uVar189);
                            }
                          }
                          if ((((pdVar50[lVar121 + lVar93 + lVar135] == 1.0) &&
                               (!NAN(pdVar50[lVar121 + lVar93 + lVar135]))) &&
                              (pdVar50[lVar138 + lVar93 + lVar135] == 1.0)) &&
                             (!NAN(pdVar50[lVar138 + lVar93 + lVar135]))) {
                            dVar205 = dVar196 - pdVar31[lVar145 + lVar104 + lVar132 + lVar125];
                            dVar209 = pdVar31[lVar147 + lVar104 + lVar132 + lVar125] - dVar196;
                            dVar205 = dVar205 + dVar205;
                            dVar209 = dVar209 + dVar209;
                            dVar195 = (pdVar31[lVar147 + lVar104 + lVar132 + lVar125] -
                                      pdVar31[lVar145 + lVar104 + lVar132 + lVar125]) * 0.5;
                            dVar199 = ABS(dVar205);
                            uVar185 = -(ulong)(0.0 < dVar195);
                            dVar195 = ABS(dVar195);
                            dVar187 = ABS(dVar209);
                            if (dVar199 <= dVar195) {
                              dVar195 = dVar199;
                            }
                            if (dVar195 <= dVar187) {
                              dVar187 = dVar195;
                            }
                            uVar189 = -(ulong)(0.0 < dVar205 * dVar209) & (ulong)dVar187;
                            dVar195 = (double)(~uVar185 & (uVar189 ^ 0x8000000000000000) |
                                              uVar185 & uVar189);
                          }
                          if (((pdVar50[lVar115 + lVar135 + lVar94] == 1.0) &&
                              (!NAN(pdVar50[lVar115 + lVar135 + lVar94]))) &&
                             ((pdVar50[lVar115 + lVar135 + lVar96] == 1.0 &&
                              (!NAN(pdVar50[lVar115 + lVar135 + lVar96]))))) {
                            dVar207 = pdVar31[lVar120 + lVar125 + lVar100 + lVar132] - dVar196;
                            dVar205 = (dVar196 - dVar216) + (dVar196 - dVar216);
                            dVar207 = dVar207 + dVar207;
                            dVar187 = (pdVar31[lVar120 + lVar125 + lVar100 + lVar132] - dVar216) *
                                      0.5;
                            dVar209 = ABS(dVar205);
                            uVar185 = -(ulong)(0.0 < dVar187);
                            dVar187 = ABS(dVar187);
                            dVar199 = ABS(dVar207);
                            if (dVar209 <= dVar187) {
                              dVar187 = dVar209;
                            }
                            if (dVar187 <= dVar199) {
                              dVar199 = dVar187;
                            }
                            uVar189 = -(ulong)(0.0 < dVar205 * dVar207) & (ulong)dVar199;
                            dVar207 = (double)(~uVar185 & (uVar189 ^ 0x8000000000000000) |
                                              uVar185 & uVar189);
                          }
                        }
                        dVar187 = dVar216;
                        if (dVar196 <= dVar216) {
                          dVar187 = dVar196;
                        }
                        if (dVar216 <= dVar196) {
                          dVar216 = dVar196;
                        }
                        dVar190 = dVar190 - dVar192;
                        iVar129 = 0;
                        iVar137 = 0;
                        iVar136 = 0;
                        iVar151 = 0;
                        uVar155 = 0xffffffff;
                        do {
                          uVar130 = uVar155 + 1;
                          uVar89 = 0xffffffff;
                          iVar161 = iVar129;
                          do {
                            uVar1 = uVar89 + 1;
                            iVar169 = 5;
                            do {
                              if (((uVar28 >> (iVar161 + iVar169 & 0x1fU) & 1) != 0) &&
                                 ((iVar169 != 6 || uVar89 != 0) || uVar155 != 0)) {
                                iVar137 = iVar137 + (uint)((iVar169 - 5U & 0xfffffffd) == 0 &&
                                                          (uVar89 == 0 && uVar155 == 0));
                                iVar136 = iVar136 + (uint)((iVar169 == 6 && uVar155 == 0) &&
                                                          (uVar1 & 0xfffffffd) == 0);
                                iVar151 = iVar151 + (uint)((iVar169 == 6 && uVar89 == 0) &&
                                                          (uVar130 & 0xfffffffd) == 0);
                              }
                              iVar169 = iVar169 + 1;
                            } while (iVar169 != 8);
                            iVar161 = iVar161 + 3;
                            uVar89 = uVar1;
                          } while (uVar1 != 2);
                          iVar129 = iVar129 + 9;
                          uVar155 = uVar130;
                        } while (uVar130 != 2);
                        dVar199 = 2.0;
                        if ((uVar28 >> 0x15 & 1) != 0) {
                          lVar125 = -1;
                          cVar150 = '\b';
                          dVar199 = dVar196;
                          dVar205 = dVar196;
                          do {
                            iVar129 = 0;
                            bVar184 = true;
                            do {
                              bVar174 = bVar184;
                              lVar126 = 0;
                              do {
                                if (((int)lVar126 != 1 || (iVar129 != 0 || (int)lVar125 != 0)) &&
                                   ((1 << ((char)lVar126 + (char)iVar129 * '\x03' + cVar150 & 0x1fU)
                                    & uVar28) != 0)) {
                                  dVar209 = pdVar31[lVar132 + (iVar84 + (int)lVar125) * lVar33 +
                                                              (iVar87 + iVar129) * lVar32 +
                                                              (long)(iVar140 + (int)lVar126)];
                                  dVar212 = dVar209;
                                  if (dVar209 <= dVar199) {
                                    dVar212 = dVar199;
                                  }
                                  dVar199 = dVar212;
                                  if (dVar209 < dVar205) {
                                    dVar205 = dVar209;
                                  }
                                }
                                lVar126 = lVar126 + 1;
                              } while (lVar126 != 3);
                              iVar129 = 1;
                              bVar184 = false;
                            } while (bVar174);
                            lVar125 = lVar125 + 1;
                            cVar150 = cVar150 + '\t';
                          } while (lVar125 != 2);
                          dVar209 = (((pdVar59 + lVar149 + lVar105 + (lVar122 - lVar171))[lVar62] -
                                     dVar211) * dVar207 +
                                    (0.5 - dVar191) * dVar195 +
                                    (pdVar59[lVar149 + lVar105 + (lVar122 - lVar171)] - dVar192) *
                                    dVar194 + dVar196) - dVar196;
                          if (dVar209 <= 1e-13) {
                            dVar199 = 1.0;
                            if ((dVar209 < -1e-13) &&
                               (dVar199 = (dVar205 - dVar196) / dVar209, 1.0 <= dVar199)) {
                              dVar199 = 1.0;
                            }
                          }
                          else {
                            dVar199 = (dVar199 - dVar196) / dVar209;
                            if (1.0 <= dVar199) {
                              dVar199 = 1.0;
                            }
                          }
                          if (2.0 <= dVar199) {
                            dVar199 = 2.0;
                          }
                        }
                        dVar205 = dVar199;
                        if ((short)uVar28 < 0) {
                          lVar125 = -1;
                          cVar150 = '\x05';
                          dVar205 = dVar196;
                          dVar209 = dVar196;
                          do {
                            lVar126 = -1;
                            cVar160 = cVar150;
                            do {
                              lVar146 = 0;
                              do {
                                if (((int)lVar146 != 1 || ((int)lVar126 != 0 || (int)lVar125 != 0))
                                   && ((1 << (cVar160 + (char)lVar146 & 0x1fU) & uVar28) != 0)) {
                                  dVar212 = pdVar31[lVar132 + (iVar84 + (int)lVar125) * lVar33 +
                                                              (iVar87 + (int)lVar126) * lVar32 +
                                                              (long)(iVar140 + (int)lVar146)];
                                  dVar213 = dVar212;
                                  if (dVar212 <= dVar205) {
                                    dVar213 = dVar205;
                                  }
                                  dVar205 = dVar213;
                                  if (dVar212 < dVar209) {
                                    dVar209 = dVar212;
                                  }
                                }
                                lVar146 = lVar146 + 1;
                              } while (lVar146 != 3);
                              cVar160 = cVar160 + '\x03';
                              bVar184 = lVar126 != 0;
                              lVar126 = lVar126 + 1;
                            } while (bVar184);
                            lVar125 = lVar125 + 1;
                            cVar150 = cVar150 + '\t';
                          } while (lVar125 != 2);
                          dVar212 = (((pdVar59 + lVar153 + lVar105 + (lVar122 - lVar171))[lVar62] -
                                     dVar211) * dVar207 +
                                    (((pdVar59[lVar153 + lVar105 + (lVar122 - lVar171)] - dVar192) *
                                      dVar194 + dVar196) - (dVar191 + 0.5) * dVar195)) - dVar196;
                          if (dVar212 <= 1e-13) {
                            dVar205 = 1.0;
                            if ((dVar212 < -1e-13) &&
                               (dVar205 = (dVar209 - dVar196) / dVar212, 1.0 <= dVar205)) {
                              dVar205 = 1.0;
                            }
                          }
                          else {
                            dVar205 = (dVar205 - dVar196) / dVar212;
                            if (1.0 <= dVar205) {
                              dVar205 = 1.0;
                            }
                          }
                          if (dVar199 <= dVar205) {
                            dVar205 = dVar199;
                          }
                        }
                        dVar199 = dVar205;
                        if ((uVar28 >> 0x13 & 1) != 0) {
                          lVar125 = -1;
                          dVar199 = dVar196;
                          dVar209 = dVar196;
                          do {
                            lVar126 = -1;
                            do {
                              iVar129 = 0;
                              dVar212 = dVar199;
                              bVar184 = true;
                              do {
                                bVar174 = bVar184;
                                dVar199 = dVar212;
                                if ((((int)lVar126 != 0 || (int)lVar125 != 0) || iVar129 != 0) &&
                                   ((1 << ((char)lVar126 * '\x03' + (char)lVar125 * '\t' + '\x12' +
                                           (char)iVar129 & 0x1fU) & uVar28) != 0)) {
                                  dVar213 = pdVar31[lVar132 + (iVar84 + (int)lVar125) * lVar33 +
                                                              (iVar87 + (int)lVar126) * lVar32 +
                                                              (long)(iVar129 + (iVar88 - iVar181))];
                                  dVar199 = dVar213;
                                  if (dVar213 <= dVar212) {
                                    dVar199 = dVar212;
                                  }
                                  if (dVar213 < dVar209) {
                                    dVar209 = dVar213;
                                  }
                                }
                                iVar129 = 1;
                                dVar212 = dVar199;
                                bVar184 = false;
                              } while (bVar174);
                              lVar126 = lVar126 + 1;
                            } while (lVar126 != 2);
                            lVar125 = lVar125 + 1;
                          } while (lVar125 != 2);
                          dVar212 = (((pdVar55 + lVar157 + lVar106 + ((iVar88 - iVar18) + 1))
                                      [lVar58] - dVar211) * dVar207 +
                                    (pdVar55[lVar157 + lVar106 + ((iVar88 - iVar18) + 1)] - dVar191)
                                    * dVar195 + (0.5 - dVar192) * dVar194 + dVar196) - dVar196;
                          if (dVar212 <= 1e-13) {
                            dVar199 = 1.0;
                            if ((dVar212 < -1e-13) &&
                               (dVar199 = (dVar209 - dVar196) / dVar212, 1.0 <= dVar199)) {
                              dVar199 = 1.0;
                            }
                          }
                          else {
                            dVar199 = (dVar199 - dVar196) / dVar212;
                            if (1.0 <= dVar199) {
                              dVar199 = 1.0;
                            }
                          }
                          if (dVar205 <= dVar199) {
                            dVar199 = dVar205;
                          }
                        }
                        dVar205 = dVar199;
                        if ((uVar28 >> 0x11 & 1) != 0) {
                          lVar125 = -1;
                          cVar150 = '\x05';
                          dVar205 = dVar196;
                          dVar209 = dVar196;
                          do {
                            lVar126 = -1;
                            cVar160 = cVar150;
                            do {
                              lVar146 = 0;
                              do {
                                if (((int)lVar146 != 1 || ((int)lVar126 != 0 || (int)lVar125 != 0))
                                   && ((1 << (cVar160 + (char)lVar146 & 0x1fU) & uVar28) != 0)) {
                                  dVar212 = pdVar31[lVar132 + (iVar84 + (int)lVar125) * lVar33 +
                                                              (iVar87 + (int)lVar126) * lVar32 +
                                                              (long)(iVar140 + (int)lVar146)];
                                  dVar213 = dVar212;
                                  if (dVar212 <= dVar205) {
                                    dVar213 = dVar205;
                                  }
                                  dVar205 = dVar213;
                                  if (dVar212 < dVar209) {
                                    dVar209 = dVar212;
                                  }
                                }
                                lVar146 = lVar146 + 1;
                              } while (lVar146 != 2);
                              lVar126 = lVar126 + 1;
                              cVar160 = cVar160 + '\x03';
                            } while (lVar126 != 2);
                            lVar125 = lVar125 + 1;
                            cVar150 = cVar150 + '\t';
                          } while (lVar125 != 2);
                          dVar212 = (((pdVar55 + lVar157 + lVar106 + (lVar122 - iVar18))[lVar58] -
                                     dVar211) * dVar207 +
                                    (pdVar55[lVar157 + lVar106 + (lVar122 - iVar18)] - dVar191) *
                                    dVar195 + (dVar196 - (dVar192 + 0.5) * dVar194)) - dVar196;
                          if (dVar212 <= 1e-13) {
                            dVar205 = 1.0;
                            if ((dVar212 < -1e-13) &&
                               (dVar205 = (dVar209 - dVar196) / dVar212, 1.0 <= dVar205)) {
                              dVar205 = 1.0;
                            }
                          }
                          else {
                            dVar205 = (dVar205 - dVar196) / dVar212;
                            if (1.0 <= dVar205) {
                              dVar205 = 1.0;
                            }
                          }
                          if (dVar199 <= dVar205) {
                            dVar205 = dVar199;
                          }
                        }
                        dVar199 = dVar205;
                        if ((uVar28 >> 0x1b & 1) != 0) {
                          iVar129 = 0;
                          dVar209 = dVar196;
                          dVar199 = dVar196;
                          bVar184 = true;
                          do {
                            bVar174 = bVar184;
                            iVar161 = iVar129 * 9 + 0xe;
                            lVar125 = -1;
                            do {
                              lVar126 = 0;
                              do {
                                if (((int)lVar126 != 1 || ((int)lVar125 != 0 || iVar129 != 0)) &&
                                   ((1 << ((char)iVar161 + (char)lVar126 & 0x1fU) & uVar28) != 0)) {
                                  dVar212 = pdVar31[lVar132 + (iVar84 + iVar129) * lVar33 +
                                                              (iVar87 + (int)lVar125) * lVar32 +
                                                              (long)(iVar140 + (int)lVar126)];
                                  dVar213 = dVar212;
                                  if (dVar212 <= dVar199) {
                                    dVar213 = dVar199;
                                  }
                                  dVar199 = dVar213;
                                  if (dVar212 < dVar209) {
                                    dVar209 = dVar212;
                                  }
                                }
                                lVar126 = lVar126 + 1;
                              } while (lVar126 != 3);
                              lVar125 = lVar125 + 1;
                              iVar161 = iVar161 + 3;
                            } while (lVar125 != 2);
                            iVar129 = 1;
                            bVar184 = false;
                          } while (bVar174);
                          dVar192 = ((0.5 - dVar211) * dVar207 +
                                    ((pdVar63 + lVar118 + lVar124 + (iVar154 - iVar22) * lVar65)
                                     [lVar66] - dVar191) * dVar195 +
                                    (pdVar63[lVar118 + lVar124 + (iVar154 - iVar22) * lVar65] -
                                    dVar192) * dVar194 + dVar196) - dVar196;
                          if (dVar192 <= 1e-13) {
                            dVar199 = 1.0;
                            if ((dVar192 < -1e-13) &&
                               (dVar199 = (dVar209 - dVar196) / dVar192, 1.0 <= dVar199)) {
                              dVar199 = 1.0;
                            }
                          }
                          else {
                            dVar199 = (dVar199 - dVar196) / dVar192;
                            if (1.0 <= dVar199) {
                              dVar199 = 1.0;
                            }
                          }
                          if (dVar205 <= dVar199) {
                            dVar199 = dVar205;
                          }
                        }
                        cVar150 = '\x05';
                        lVar124 = -1;
                        dVar192 = dVar196;
                        dVar191 = dVar196;
                        do {
                          lVar125 = -1;
                          cVar160 = cVar150;
                          do {
                            lVar126 = 0;
                            do {
                              if (((int)lVar126 != 1 || ((int)lVar125 != 0 || (int)lVar124 != 0)) &&
                                 ((1 << (cVar160 + (char)lVar126 & 0x1fU) & uVar28) != 0)) {
                                dVar205 = pdVar31[lVar132 + (iVar84 + (int)lVar124) * lVar33 +
                                                            (iVar87 + (int)lVar125) * lVar32 +
                                                            (long)(iVar140 + (int)lVar126)];
                                dVar209 = dVar205;
                                if (dVar205 <= dVar191) {
                                  dVar209 = dVar191;
                                }
                                dVar191 = dVar209;
                                if (dVar205 < dVar192) {
                                  dVar192 = dVar205;
                                }
                              }
                              lVar126 = lVar126 + 1;
                            } while (lVar126 != 3);
                            lVar125 = lVar125 + 1;
                            cVar160 = cVar160 + '\x03';
                          } while (lVar125 != 2);
                          cVar150 = cVar150 + '\t';
                          bVar184 = lVar124 != 0;
                          lVar124 = lVar124 + 1;
                        } while (bVar184);
                        dVar205 = ((dVar204 * dVar195 + dVar190 * dVar194 + dVar196) -
                                  (dVar211 + 0.5) * dVar207) - dVar196;
                        if (dVar205 <= 1e-13) {
                          dVar191 = 1.0;
                          if ((dVar205 < -1e-13) &&
                             (dVar191 = (dVar192 - dVar196) / dVar205, 1.0 <= dVar191)) {
                            dVar191 = 1.0;
                          }
                        }
                        else {
                          dVar191 = (dVar191 - dVar196) / dVar205;
                          if (1.0 <= dVar191) {
                            dVar191 = 1.0;
                          }
                        }
                        if (dVar199 <= dVar191) {
                          dVar191 = dVar199;
                        }
                        dVar192 = 0.0;
                        if (1 < iVar137) {
                          dVar192 = dVar191;
                        }
                        dVar199 = 0.0;
                        if (1 < iVar136) {
                          dVar199 = dVar191;
                        }
                        dVar205 = 0.0;
                        if (1 < iVar151) {
                          dVar205 = dVar191;
                        }
                        if ((dVar201 != 1.0) || (NAN(dVar201))) {
                          local_918 = pdVar50[lVar115 + lVar135 + lVar94];
                        }
                        else {
                          if ((((pdVar50[lVar115 + lVar93 + (int)(~uVar13 + iVar88)] == 1.0) &&
                               (!NAN(pdVar50[lVar115 + lVar93 + (int)(~uVar13 + iVar88)]))) &&
                              (pdVar50[lVar115 + lVar93 + (int)((iVar88 - uVar13) + 1)] == 1.0)) &&
                             (!NAN(pdVar50[lVar115 + lVar93 + (int)((iVar88 - uVar13) + 1)]))) {
                            dVar192 = 1.0;
                          }
                          if (((pdVar50[lVar164 + lVar93 + lVar135] == 1.0) &&
                              (!NAN(pdVar50[lVar164 + lVar93 + lVar135]))) &&
                             ((pdVar50[lVar143 + lVar93 + lVar135] == 1.0 &&
                              (!NAN(pdVar50[lVar143 + lVar93 + lVar135]))))) {
                            dVar199 = 1.0;
                          }
                          local_918 = pdVar50[lVar115 + lVar135 + lVar94];
                          if ((local_918 == 1.0) && (!NAN(local_918))) {
                            local_918 = 1.0;
                            if ((pdVar50[lVar115 + lVar135 + lVar107] == 1.0) &&
                               (!NAN(pdVar50[lVar115 + lVar135 + lVar107]))) {
                              dVar205 = 1.0;
                            }
                          }
                        }
                        dVar190 = (-0.5 - dVar211) * dVar207 * dVar205 +
                                  dVar204 * dVar195 * dVar199 +
                                  dVar190 * dVar194 * dVar192 + dVar196;
                        if (dVar190 <= dVar216) {
                          dVar216 = dVar190;
                        }
                        if (dVar187 <= dVar216) {
                          dVar187 = dVar216;
                        }
                        dVar187 = pdVar35[lVar117 + lVar98 + lVar38 * 2 + (lVar122 - lVar162)] *
                                  dVar186 * -0.5 * dVar207 * dVar205 + dVar187;
                        if ((local_918 == 1.0) && (!NAN(local_918))) goto LAB_0031ac73;
                        bVar184 = false;
LAB_0031b073:
                        lVar124 = lVar122 - lVar173;
                        dVar204 = pdVar63[lVar118 + lVar124 + lVar102];
                        dVar211 = (pdVar63 + lVar118 + lVar124 + lVar102)[lVar66];
                        pdVar158 = pdVar30 + iVar85 * lVar54 +
                                             (iVar180 - iVar16) * lVar53 + (long)(iVar88 - iVar175);
                        dVar192 = pdVar158[lVar29 * 2];
                        dVar191 = *pdVar158;
                        dVar196 = pdVar158[lVar29];
                        lVar125 = (long)(iVar88 - iVar181);
                        dVar216 = pdVar31[lVar120 + lVar125 + lVar97 + lVar132];
                        dVar194 = pdVar31[lVar120 + lVar125 + lVar109 + lVar132];
                        uVar28 = pEVar47[lVar114 + lVar123 + (lVar2 - lVar176) * lVar49].flag;
                        lVar126 = -1;
                        cVar150 = '\x05';
                        lVar123 = 0;
                        do {
                          iVar137 = (int)lVar126;
                          lVar146 = -1;
                          cVar160 = cVar150;
                          do {
                            iVar136 = (int)lVar146;
                            iVar129 = (int)lVar123;
                            ppdVar139 = &local_2d8.q.p + (long)iVar129 * 3;
                            lVar123 = 0;
                            do {
                              iVar151 = (int)lVar123 + -1;
                              if (((iVar136 == 0 && iVar137 == 0) && iVar151 == 0) ||
                                 ((1 << (cVar160 + (char)lVar123 & 0x1fU) & uVar28) == 0)) {
                                *ppdVar139 = (double *)0x0;
                                ppdVar139[1] = (double *)0x0;
                                ppdVar139[2] = (double *)0x0;
                              }
                              else {
                                pdVar158 = pdVar30 + (iVar85 + iVar137) * lVar54 +
                                                     ((iVar180 - iVar16) + iVar136) * lVar53 +
                                                     (long)(iVar80 + (int)lVar123);
                                dVar190 = pdVar158[lVar29];
                                *ppdVar139 = (double *)((*pdVar158 + (double)iVar151) - dVar191);
                                ppdVar139[1] = (double *)((dVar190 + (double)iVar136) - dVar196);
                                ppdVar139[2] = (double *)
                                               ((pdVar158[lVar29 * 2] + (double)iVar137) - dVar192);
                              }
                              lVar123 = lVar123 + 1;
                              ppdVar139 = ppdVar139 + 3;
                            } while (lVar123 != 3);
                            lVar146 = lVar146 + 1;
                            cVar160 = cVar160 + '\x03';
                            lVar123 = (long)iVar129 + 3;
                          } while (lVar146 != 2);
                          lVar126 = lVar126 + 1;
                          cVar150 = cVar150 + '\t';
                          lVar123 = (long)iVar129 + 3;
                        } while (lVar126 != 2);
                        lVar126 = -1;
                        cVar150 = '\x05';
                        lVar123 = 0;
                        do {
                          lVar146 = -1;
                          cVar160 = cVar150;
                          do {
                            iVar137 = (int)lVar123;
                            lVar123 = 0;
                            do {
                              dVar190 = 0.0;
                              if (((int)lVar123 != 1 || ((int)lVar146 != 0 || (int)lVar126 != 0)) &&
                                 ((1 << (cVar160 + (char)lVar123 & 0x1fU) & uVar28) != 0)) {
                                dVar190 = pdVar31[lVar132 + (iVar86 + (int)lVar126) * lVar33 +
                                                            (iVar87 + (int)lVar146) * lVar32 +
                                                            (long)(iVar140 + (int)lVar123)] -
                                          dVar194;
                              }
                              adStack_3b8[iVar137 + lVar123] = dVar190;
                              lVar123 = lVar123 + 1;
                            } while (lVar123 != 3);
                            lVar146 = lVar146 + 1;
                            cVar160 = cVar160 + '\x03';
                            lVar123 = (long)iVar137 + 3;
                          } while (lVar146 != 2);
                          lVar126 = lVar126 + 1;
                          cVar150 = cVar150 + '\t';
                          lVar123 = (long)iVar137 + 3;
                        } while (lVar126 != 2);
                        dVar211 = dVar211 - dVar196;
                        dVar199 = 0.0;
                        dVar205 = 0.0;
                        dVar188 = 0.0;
                        pLVar127 = &local_2d8.q.kstride;
                        lVar123 = 0;
                        dVar207 = 0.0;
                        dVar209 = 0.0;
                        dVar190 = 0.0;
                        dVar195 = 0.0;
                        dVar212 = 0.0;
                        dVar213 = 0.0;
                        do {
                          pdVar158 = ((Array4<const_double> *)(pLVar127 + -2))->p;
                          dVar210 = (double)pLVar127[-1];
                          dVar200 = adStack_3b8[lVar123];
                          dVar212 = dVar212 + (double)pdVar158 * (double)pdVar158;
                          dVar213 = dVar213 + dVar210 * dVar210;
                          dVar208 = (double)*pLVar127;
                          dVar188 = dVar188 + dVar210 * dVar208;
                          dVar199 = dVar199 + (double)pdVar158 * dVar200;
                          dVar205 = dVar205 + (double)pdVar158 * dVar208;
                          dVar207 = dVar207 + dVar210 * (double)pdVar158;
                          dVar209 = dVar209 + dVar200 * dVar210;
                          dVar190 = dVar190 + dVar208 * dVar200;
                          dVar195 = dVar195 + dVar208 * dVar208;
                          lVar123 = lVar123 + 1;
                          pLVar127 = pLVar127 + 3;
                        } while (lVar123 != 0x1b);
                        dVar214 = dVar195 * dVar207 + -dVar188 * dVar205;
                        dVar215 = dVar213 * dVar195 - dVar188 * dVar188;
                        dVar210 = dVar207 * dVar188 - dVar213 * dVar205;
                        dVar200 = dVar190 * dVar207 - dVar205 * dVar209;
                        dVar208 = dVar195 * dVar209 - dVar190 * dVar188;
                        auVar197._0_8_ =
                             dVar199 * dVar210 +
                             (dVar212 * (dVar213 * dVar190 - dVar188 * dVar209) - dVar207 * dVar200)
                        ;
                        auVar197._8_8_ =
                             dVar205 * (dVar209 * dVar188 - dVar213 * dVar190) +
                             (dVar199 * dVar215 - dVar207 * dVar208);
                        dVar195 = dVar210 * dVar205 + (dVar215 * dVar212 - dVar214 * dVar207);
                        auVar193._8_8_ = dVar195;
                        auVar193._0_8_ = dVar195;
                        dVar195 = (dVar200 * dVar205 + (dVar208 * dVar212 - dVar214 * dVar199)) /
                                  dVar195;
                        auVar198 = divpd(auVar197,auVar193);
                        if (bVar184) {
                          uVar185 = auVar198._8_8_;
                          if ((pdVar50[lVar115 + lVar94 + ((lVar122 + -1) - lVar177)] == 1.0) &&
                             (!NAN(pdVar50[lVar115 + lVar94 + ((lVar122 + -1) - lVar177)]))) {
                            if ((pdVar50[lVar115 + lVar94 + ((lVar122 + 1) - lVar177)] == 1.0) &&
                               (!NAN(pdVar50[lVar115 + lVar94 + ((lVar122 + 1) - lVar177)]))) {
                              dVar205 = dVar194 - pdVar31[lVar120 + lVar109 + lVar132 + ((lVar122 +
                                                                                         -1) - 
                                                  lVar156)];
                              dVar207 = pdVar31[lVar120 + lVar109 + lVar132 + ((lVar122 + 1) -
                                                                              lVar156)] - dVar194;
                              dVar205 = dVar205 + dVar205;
                              dVar207 = dVar207 + dVar207;
                              dVar190 = (pdVar31[lVar120 + lVar109 + lVar132 + ((lVar122 + 1) -
                                                                               lVar156)] -
                                        pdVar31[lVar120 + lVar109 + lVar132 + ((lVar122 + -1) -
                                                                              lVar156)]) * 0.5;
                              dVar209 = ABS(dVar205);
                              uVar185 = -(ulong)(0.0 < dVar190);
                              dVar190 = ABS(dVar190);
                              dVar199 = ABS(dVar207);
                              if (dVar209 <= dVar190) {
                                dVar190 = dVar209;
                              }
                              if (dVar190 <= dVar199) {
                                dVar199 = dVar190;
                              }
                              uVar189 = -(ulong)(0.0 < dVar205 * dVar207) & (ulong)dVar199;
                              uVar185 = ~uVar185 & (uVar189 ^ 0x8000000000000000) |
                                        uVar185 & uVar189;
                            }
                          }
                          if ((((pdVar50[lVar121 + lVar94 + lVar135] == 1.0) &&
                               (!NAN(pdVar50[lVar121 + lVar94 + lVar135]))) &&
                              (pdVar50[lVar138 + lVar94 + lVar135] == 1.0)) &&
                             (!NAN(pdVar50[lVar138 + lVar94 + lVar135]))) {
                            dVar199 = dVar194 - pdVar31[lVar145 + lVar109 + lVar132 + lVar125];
                            dVar205 = pdVar31[lVar147 + lVar109 + lVar132 + lVar125] - dVar194;
                            dVar199 = dVar199 + dVar199;
                            dVar205 = dVar205 + dVar205;
                            dVar190 = (pdVar31[lVar147 + lVar109 + lVar132 + lVar125] -
                                      pdVar31[lVar145 + lVar109 + lVar132 + lVar125]) * 0.5;
                            dVar207 = ABS(dVar199);
                            uVar189 = -(ulong)(0.0 < dVar190);
                            dVar190 = ABS(dVar190);
                            dVar195 = ABS(dVar205);
                            if (dVar207 <= dVar190) {
                              dVar190 = dVar207;
                            }
                            if (dVar190 <= dVar195) {
                              dVar195 = dVar190;
                            }
                            uVar206 = -(ulong)(0.0 < dVar199 * dVar205) & (ulong)dVar195;
                            dVar195 = (double)(~uVar189 & (uVar206 ^ 0x8000000000000000) |
                                              uVar189 & uVar206);
                          }
                          auVar198._8_8_ = uVar185;
                          if (((dVar201 == 1.0) && (!NAN(dVar201))) &&
                             ((pdVar50[lVar115 + lVar135 + lVar95] == 1.0 &&
                              (!NAN(pdVar50[lVar115 + lVar135 + lVar95]))))) {
                            dVar207 = dVar194 - pdVar31[lVar120 + lVar125 + lVar101 + lVar132];
                            dVar205 = (dVar216 - dVar194) + (dVar216 - dVar194);
                            dVar207 = dVar207 + dVar207;
                            dVar190 = (dVar216 - pdVar31[lVar120 + lVar125 + lVar101 + lVar132]) *
                                      0.5;
                            dVar209 = ABS(dVar207);
                            uVar189 = -(ulong)(0.0 < dVar190);
                            dVar190 = ABS(dVar190);
                            dVar199 = ABS(dVar205);
                            if (dVar209 <= dVar190) {
                              dVar190 = dVar209;
                            }
                            if (dVar190 <= dVar199) {
                              dVar199 = dVar190;
                            }
                            uVar206 = -(ulong)(0.0 < dVar207 * dVar205) & (ulong)dVar199;
                            auVar198._0_8_ =
                                 ~uVar189 & (uVar206 ^ 0x8000000000000000) | uVar189 & uVar206;
                          }
                        }
                        dVar190 = dVar194;
                        if (dVar216 <= dVar194) {
                          dVar190 = dVar216;
                        }
                        dVar199 = dVar194;
                        if (dVar194 <= dVar216) {
                          dVar199 = dVar216;
                        }
                        dVar204 = dVar204 - dVar191;
                        iVar136 = 0;
                        iVar137 = 0;
                        iVar129 = 0;
                        iVar151 = 0;
                        uVar155 = 0xffffffff;
                        do {
                          uVar130 = uVar155 + 1;
                          uVar89 = 0xffffffff;
                          iVar161 = iVar136;
                          do {
                            uVar1 = uVar89 + 1;
                            iVar169 = 5;
                            do {
                              if (((uVar28 >> (iVar161 + iVar169 & 0x1fU) & 1) != 0) &&
                                 ((iVar169 != 6 || uVar89 != 0) || uVar155 != 0)) {
                                iVar137 = iVar137 + (uint)((iVar169 - 5U & 0xfffffffd) == 0 &&
                                                          (uVar89 == 0 && uVar155 == 0));
                                iVar129 = iVar129 + (uint)((iVar169 == 6 && uVar155 == 0) &&
                                                          (uVar1 & 0xfffffffd) == 0);
                                iVar151 = iVar151 + (uint)((iVar169 == 6 && uVar89 == 0) &&
                                                          (uVar130 & 0xfffffffd) == 0);
                              }
                              iVar169 = iVar169 + 1;
                            } while (iVar169 != 8);
                            iVar161 = iVar161 + 3;
                            uVar89 = uVar1;
                          } while (uVar1 != 2);
                          iVar136 = iVar136 + 9;
                          uVar155 = uVar130;
                        } while (uVar130 != 2);
                        dVar207 = auVar198._8_8_;
                        dVar216 = 2.0;
                        dVar205 = auVar198._0_8_;
                        if ((uVar28 >> 0x15 & 1) != 0) {
                          lVar123 = -1;
                          cVar150 = '\b';
                          dVar216 = dVar194;
                          dVar209 = dVar194;
                          do {
                            iVar136 = 0;
                            bVar184 = true;
                            do {
                              bVar174 = bVar184;
                              lVar125 = 0;
                              dVar212 = dVar216;
                              do {
                                dVar216 = dVar212;
                                if (((int)lVar125 != 1 || (iVar136 != 0 || (int)lVar123 != 0)) &&
                                   ((1 << ((char)lVar125 + (char)iVar136 * '\x03' + cVar150 & 0x1fU)
                                    & uVar28) != 0)) {
                                  dVar213 = pdVar31[lVar132 + (iVar86 + (int)lVar123) * lVar33 +
                                                              (iVar87 + iVar136) * lVar32 +
                                                              (long)(iVar140 + (int)lVar125)];
                                  dVar216 = dVar213;
                                  if (dVar213 <= dVar212) {
                                    dVar216 = dVar212;
                                  }
                                  if (dVar213 < dVar209) {
                                    dVar209 = dVar213;
                                  }
                                }
                                lVar125 = lVar125 + 1;
                                dVar212 = dVar216;
                              } while (lVar125 != 3);
                              iVar136 = 1;
                              bVar184 = false;
                            } while (bVar174);
                            lVar123 = lVar123 + 1;
                            cVar150 = cVar150 + '\t';
                          } while (lVar123 != 2);
                          dVar212 = (((pdVar59 + lVar149 + lVar110 + (lVar122 - lVar171))[lVar62] -
                                     dVar192) * dVar205 +
                                    (0.5 - dVar196) * dVar195 +
                                    (pdVar59[lVar149 + lVar110 + (lVar122 - lVar171)] - dVar191) *
                                    dVar207 + dVar194) - dVar194;
                          if (dVar212 <= 1e-13) {
                            dVar216 = 1.0;
                            if ((dVar212 < -1e-13) &&
                               (dVar216 = (dVar209 - dVar194) / dVar212, 1.0 <= dVar216)) {
                              dVar216 = 1.0;
                            }
                          }
                          else {
                            dVar216 = (dVar216 - dVar194) / dVar212;
                            if (1.0 <= dVar216) {
                              dVar216 = 1.0;
                            }
                          }
                          if (2.0 <= dVar216) {
                            dVar216 = 2.0;
                          }
                        }
                        dVar209 = dVar216;
                        if ((short)uVar28 < 0) {
                          lVar125 = -1;
                          cVar150 = '\x05';
                          lVar123 = lVar134;
                          dVar212 = dVar194;
                          dVar209 = dVar194;
                          do {
                            lVar126 = lVar123;
                            lVar146 = -1;
                            cVar160 = cVar150;
                            do {
                              lVar148 = 0;
                              do {
                                if (((int)lVar148 != 1 || ((int)lVar146 != 0 || (int)lVar125 != 0))
                                   && ((1 << (cVar160 + (char)lVar148 & 0x1fU) & uVar28) != 0)) {
                                  dVar213 = *(double *)(lVar126 + lVar148 * 8);
                                  dVar188 = dVar213;
                                  if (dVar213 <= dVar209) {
                                    dVar188 = dVar209;
                                  }
                                  dVar209 = dVar188;
                                  if (dVar213 < dVar212) {
                                    dVar212 = dVar213;
                                  }
                                }
                                lVar148 = lVar148 + 1;
                              } while (lVar148 != 3);
                              lVar126 = lVar126 + lVar32 * 8;
                              cVar160 = cVar160 + '\x03';
                              bVar184 = lVar146 != 0;
                              lVar146 = lVar146 + 1;
                            } while (bVar184);
                            lVar125 = lVar125 + 1;
                            lVar123 = lVar123 + lVar33 * 8;
                            cVar150 = cVar150 + '\t';
                          } while (lVar125 != 2);
                          dVar213 = (((pdVar59 + lVar153 + lVar110 + (lVar122 - lVar171))[lVar62] -
                                     dVar192) * dVar205 +
                                    (((pdVar59[lVar153 + lVar110 + (lVar122 - lVar171)] - dVar191) *
                                      dVar207 + dVar194) - (dVar196 + 0.5) * dVar195)) - dVar194;
                          if (dVar213 <= 1e-13) {
                            dVar209 = 1.0;
                            if ((dVar213 < -1e-13) &&
                               (dVar209 = (dVar212 - dVar194) / dVar213, 1.0 <= dVar209)) {
                              dVar209 = 1.0;
                            }
                          }
                          else {
                            dVar209 = (dVar209 - dVar194) / dVar213;
                            if (1.0 <= dVar209) {
                              dVar209 = 1.0;
                            }
                          }
                          if (dVar216 <= dVar209) {
                            dVar209 = dVar216;
                          }
                        }
                        dVar216 = dVar209;
                        if ((uVar28 >> 0x13 & 1) != 0) {
                          lVar123 = -1;
                          dVar216 = dVar194;
                          dVar212 = dVar194;
                          do {
                            lVar125 = -1;
                            do {
                              iVar136 = 0;
                              dVar213 = dVar216;
                              bVar184 = true;
                              do {
                                bVar174 = bVar184;
                                dVar216 = dVar213;
                                if ((((int)lVar125 != 0 || (int)lVar123 != 0) || iVar136 != 0) &&
                                   ((1 << ((char)lVar125 * '\x03' + (char)lVar123 * '\t' + '\x12' +
                                           (char)iVar136 & 0x1fU) & uVar28) != 0)) {
                                  dVar188 = pdVar31[lVar132 + (iVar86 + (int)lVar123) * lVar33 +
                                                              (iVar87 + (int)lVar125) * lVar32 +
                                                              (long)(iVar136 + (iVar88 - iVar181))];
                                  dVar216 = dVar188;
                                  if (dVar188 <= dVar213) {
                                    dVar216 = dVar213;
                                  }
                                  if (dVar188 < dVar212) {
                                    dVar212 = dVar188;
                                  }
                                }
                                iVar136 = 1;
                                dVar213 = dVar216;
                                bVar184 = false;
                              } while (bVar174);
                              lVar125 = lVar125 + 1;
                            } while (lVar125 != 2);
                            lVar123 = lVar123 + 1;
                          } while (lVar123 != 2);
                          dVar213 = (((pdVar55 + lVar157 + lVar111 + ((iVar88 - iVar18) + 1))
                                      [lVar58] - dVar192) * dVar205 +
                                    (pdVar55[lVar157 + lVar111 + ((iVar88 - iVar18) + 1)] - dVar196)
                                    * dVar195 + (0.5 - dVar191) * dVar207 + dVar194) - dVar194;
                          if (dVar213 <= 1e-13) {
                            dVar216 = 1.0;
                            if ((dVar213 < -1e-13) &&
                               (dVar216 = (dVar212 - dVar194) / dVar213, 1.0 <= dVar216)) {
                              dVar216 = 1.0;
                            }
                          }
                          else {
                            dVar216 = (dVar216 - dVar194) / dVar213;
                            if (1.0 <= dVar216) {
                              dVar216 = 1.0;
                            }
                          }
                          if (dVar209 <= dVar216) {
                            dVar216 = dVar209;
                          }
                        }
                        dVar209 = dVar216;
                        if ((uVar28 >> 0x11 & 1) != 0) {
                          lVar123 = -1;
                          cVar150 = '\x05';
                          dVar209 = dVar194;
                          dVar212 = dVar194;
                          do {
                            lVar125 = -1;
                            cVar160 = cVar150;
                            do {
                              lVar126 = 0;
                              do {
                                if (((int)lVar126 != 1 || ((int)lVar125 != 0 || (int)lVar123 != 0))
                                   && ((1 << (cVar160 + (char)lVar126 & 0x1fU) & uVar28) != 0)) {
                                  dVar213 = pdVar31[lVar132 + (iVar86 + (int)lVar123) * lVar33 +
                                                              (iVar87 + (int)lVar125) * lVar32 +
                                                              (long)(iVar140 + (int)lVar126)];
                                  dVar188 = dVar213;
                                  if (dVar213 <= dVar209) {
                                    dVar188 = dVar209;
                                  }
                                  dVar209 = dVar188;
                                  if (dVar213 < dVar212) {
                                    dVar212 = dVar213;
                                  }
                                }
                                lVar126 = lVar126 + 1;
                              } while (lVar126 != 2);
                              lVar125 = lVar125 + 1;
                              cVar160 = cVar160 + '\x03';
                            } while (lVar125 != 2);
                            lVar123 = lVar123 + 1;
                            cVar150 = cVar150 + '\t';
                          } while (lVar123 != 2);
                          dVar213 = (((pdVar55 + lVar157 + lVar111 + (lVar122 - iVar18))[lVar58] -
                                     dVar192) * dVar205 +
                                    (pdVar55[lVar157 + lVar111 + (lVar122 - iVar18)] - dVar196) *
                                    dVar195 + (dVar194 - (dVar191 + 0.5) * dVar207)) - dVar194;
                          if (dVar213 <= 1e-13) {
                            dVar209 = 1.0;
                            if ((dVar213 < -1e-13) &&
                               (dVar209 = (dVar212 - dVar194) / dVar213, 1.0 <= dVar209)) {
                              dVar209 = 1.0;
                            }
                          }
                          else {
                            dVar209 = (dVar209 - dVar194) / dVar213;
                            if (1.0 <= dVar209) {
                              dVar209 = 1.0;
                            }
                          }
                          if (dVar216 <= dVar209) {
                            dVar209 = dVar216;
                          }
                        }
                        dVar216 = dVar209;
                        if ((uVar28 >> 0x1b & 1) != 0) {
                          iVar136 = 0;
                          dVar212 = dVar194;
                          bVar184 = true;
                          dVar216 = dVar194;
                          do {
                            bVar174 = bVar184;
                            iVar161 = iVar136 * 9 + 0xe;
                            lVar123 = -1;
                            do {
                              lVar125 = 0;
                              do {
                                if (((int)lVar125 != 1 || ((int)lVar123 != 0 || iVar136 != 0)) &&
                                   ((1 << ((char)iVar161 + (char)lVar125 & 0x1fU) & uVar28) != 0)) {
                                  dVar213 = pdVar31[lVar132 + (iVar86 + iVar136) * lVar33 +
                                                              (iVar87 + (int)lVar123) * lVar32 +
                                                              (long)(iVar140 + (int)lVar125)];
                                  dVar188 = dVar213;
                                  if (dVar213 <= dVar216) {
                                    dVar188 = dVar216;
                                  }
                                  dVar216 = dVar188;
                                  if (dVar213 < dVar212) {
                                    dVar212 = dVar213;
                                  }
                                }
                                lVar125 = lVar125 + 1;
                              } while (lVar125 != 3);
                              lVar123 = lVar123 + 1;
                              iVar161 = iVar161 + 3;
                            } while (lVar123 != 2);
                            iVar136 = 1;
                            bVar184 = false;
                          } while (bVar174);
                          dVar213 = ((0.5 - dVar192) * dVar205 +
                                    dVar211 * dVar195 + dVar204 * dVar207 + dVar194) - dVar194;
                          if (dVar213 <= 1e-13) {
                            dVar216 = 1.0;
                            if ((dVar213 < -1e-13) &&
                               (dVar216 = (dVar212 - dVar194) / dVar213, 1.0 <= dVar216)) {
                              dVar216 = 1.0;
                            }
                          }
                          else {
                            dVar216 = (dVar216 - dVar194) / dVar213;
                            if (1.0 <= dVar216) {
                              dVar216 = 1.0;
                            }
                          }
                          if (dVar209 <= dVar216) {
                            dVar216 = dVar209;
                          }
                        }
                        dVar209 = dVar216;
                        if ((uVar28 >> 9 & 1) != 0) {
                          cVar150 = '\x05';
                          lVar123 = -1;
                          dVar209 = dVar194;
                          dVar212 = dVar194;
                          do {
                            lVar125 = -1;
                            cVar160 = cVar150;
                            do {
                              lVar126 = 0;
                              do {
                                if (((int)lVar126 != 1 || ((int)lVar125 != 0 || (int)lVar123 != 0))
                                   && ((1 << (cVar160 + (char)lVar126 & 0x1fU) & uVar28) != 0)) {
                                  dVar213 = pdVar31[lVar132 + (iVar86 + (int)lVar123) * lVar33 +
                                                              (iVar87 + (int)lVar125) * lVar32 +
                                                              (long)(iVar140 + (int)lVar126)];
                                  dVar188 = dVar213;
                                  if (dVar213 <= dVar209) {
                                    dVar188 = dVar209;
                                  }
                                  dVar209 = dVar188;
                                  if (dVar213 < dVar212) {
                                    dVar212 = dVar213;
                                  }
                                }
                                lVar126 = lVar126 + 1;
                              } while (lVar126 != 3);
                              lVar125 = lVar125 + 1;
                              cVar160 = cVar160 + '\x03';
                            } while (lVar125 != 2);
                            cVar150 = cVar150 + '\t';
                            bVar184 = lVar123 != 0;
                            lVar123 = lVar123 + 1;
                          } while (bVar184);
                          dVar191 = ((((pdVar63 + lVar118 + lVar124 + (lVar2 - iVar22) * lVar65)
                                       [lVar66] - dVar196) * dVar195 +
                                     (pdVar63[lVar118 + lVar124 + (lVar2 - iVar22) * lVar65] -
                                     dVar191) * dVar207 + dVar194) - (dVar192 + 0.5) * dVar205) -
                                    dVar194;
                          if (dVar191 <= 1e-13) {
                            dVar209 = 1.0;
                            if ((dVar191 < -1e-13) &&
                               (dVar209 = (dVar212 - dVar194) / dVar191, 1.0 <= dVar209)) {
                              dVar209 = 1.0;
                            }
                          }
                          else {
                            dVar209 = (dVar209 - dVar194) / dVar191;
                            if (1.0 <= dVar209) {
                              dVar209 = 1.0;
                            }
                          }
                          if (dVar216 <= dVar209) {
                            dVar209 = dVar216;
                          }
                        }
                        dVar191 = 0.0;
                        if (1 < iVar137) {
                          dVar191 = dVar209;
                        }
                        dVar196 = 0.0;
                        if (1 < iVar129) {
                          dVar196 = dVar209;
                        }
                        dVar216 = 0.0;
                        if (1 < iVar151) {
                          dVar216 = dVar209;
                        }
                        if ((local_918 == 1.0) && (!NAN(local_918))) {
                          if ((pdVar50[lVar115 + lVar94 + (int)(~uVar13 + iVar88)] == 1.0) &&
                             (((!NAN(pdVar50[lVar115 + lVar94 + (int)(~uVar13 + iVar88)]) &&
                               (pdVar50[lVar115 + lVar94 + (int)((iVar88 - uVar13) + 1)] == 1.0)) &&
                              (!NAN(pdVar50[lVar115 + lVar94 + (int)((iVar88 - uVar13) + 1)]))))) {
                            dVar191 = 1.0;
                          }
                          if (((pdVar50[lVar164 + lVar94 + lVar135] == 1.0) &&
                              (!NAN(pdVar50[lVar164 + lVar94 + lVar135]))) &&
                             ((pdVar50[lVar143 + lVar94 + lVar135] == 1.0 &&
                              (!NAN(pdVar50[lVar143 + lVar94 + lVar135]))))) {
                            dVar196 = 1.0;
                          }
                          if (((dVar201 == 1.0) && (!NAN(dVar201))) &&
                             ((pdVar50[lVar115 + lVar135 + lVar108] == 1.0 &&
                              (!NAN(pdVar50[lVar115 + lVar135 + lVar108]))))) {
                            dVar216 = 1.0;
                          }
                        }
                        dVar201 = (0.5 - dVar192) * dVar205 * dVar216 +
                                  dVar211 * dVar195 * dVar196 +
                                  dVar204 * dVar207 * dVar191 + dVar194;
                        if (dVar201 <= dVar199) {
                          dVar199 = dVar201;
                        }
                        if (dVar190 <= dVar199) {
                          dVar190 = dVar199;
                        }
                        dVar190 = pdVar35[lVar117 + lVar152 + lVar38 * 2 + (lVar122 - lVar162)] *
                                  dVar186 * -0.5 * dVar205 * dVar216 + dVar190;
                      }
                      else {
                        dVar190 = pdVar50[lVar115 + lVar135 + lVar96];
                        if (((pdVar50[lVar115 + lVar135 + lVar95] != 1.0) ||
                            (NAN(pdVar50[lVar115 + lVar135 + lVar95]))) ||
                           ((dVar190 != 1.0 || (NAN(dVar190))))) {
                          if ((dVar190 != 1.0) || (NAN(dVar190))) goto LAB_003194a7;
LAB_0031ab6e:
                          lVar124 = lVar122 - lVar156;
                          dVar190 = pdVar31[lVar116 + lVar124 + lVar97 + lVar132];
                          dVar192 = dVar190 - pdVar31[lVar116 + lVar124 + lVar99 + lVar132];
                          dVar191 = pdVar31[lVar116 + lVar124 + lVar100 + lVar132] - dVar190;
                          dVar192 = dVar192 + dVar192;
                          dVar191 = dVar191 + dVar191;
                          dVar187 = (pdVar31[lVar116 + lVar124 + lVar100 + lVar132] -
                                    pdVar31[lVar116 + lVar124 + lVar99 + lVar132]) * 0.5;
                          dVar211 = ABS(dVar192);
                          uVar185 = -(ulong)(0.0 < dVar187);
                          dVar187 = ABS(dVar187);
                          dVar204 = ABS(dVar191);
                          if (dVar211 <= dVar187) {
                            dVar187 = dVar211;
                          }
                          if (dVar187 <= dVar204) {
                            dVar204 = dVar187;
                          }
                          uVar189 = -(ulong)(0.0 < dVar192 * dVar191) & (ulong)dVar204;
                          dVar187 = (double)(~uVar185 & (uVar189 ^ 0x8000000000000000) |
                                            uVar185 & uVar189) *
                                    (-1.0 - pdVar35[lVar117 + lVar98 + lVar38 * 2 +
                                                                       (lVar122 - lVar162)] *
                                            dVar186) * 0.5;
                        }
                        else {
                          if ((pdVar50[lVar115 + lVar135 + ((lVar128 + 2) - lVar182) * lVar52] !=
                               1.0) || (NAN(pdVar50[lVar115 + lVar135 + ((lVar128 + 2) - lVar182) *
                                                                        lVar52])))
                          goto LAB_0031ab6e;
                          lVar124 = lVar122 - lVar156;
                          dVar190 = pdVar31[lVar116 + lVar124 + lVar97 + lVar132];
                          dVar211 = dVar190 - pdVar31[lVar116 + lVar124 + lVar99 + lVar132];
                          dVar192 = pdVar31[lVar116 + lVar124 + lVar99 + lVar132] -
                                    pdVar31[lVar116 + lVar124 + lVar101 + lVar132];
                          dVar204 = 0.0;
                          dVar187 = 0.0;
                          if (0.0 <= dVar211 * dVar192) {
                            dVar187 = ABS(dVar211);
                            if (ABS(dVar192) <= ABS(dVar211)) {
                              dVar187 = ABS(dVar192);
                            }
                            dVar187 = dVar187 + dVar187;
                          }
                          dVar196 = pdVar31[lVar116 + lVar124 + ((lVar128 + 2) - lVar91) * lVar33 +
                                                                lVar132] -
                                    pdVar31[lVar116 + lVar124 + lVar100 + lVar132];
                          dVar216 = pdVar31[lVar116 + lVar124 + lVar100 + lVar132] - dVar190;
                          dVar191 = (dVar216 + dVar196) * 0.5;
                          if (0.0 <= dVar216 * dVar196) {
                            dVar204 = ABS(dVar196);
                            if (ABS(dVar216) <= ABS(dVar196)) {
                              dVar204 = ABS(dVar216);
                            }
                            dVar204 = dVar204 + dVar204;
                          }
                          dVar194 = (dVar211 + dVar216) * 0.5;
                          dVar196 = 0.0;
                          if (0.0 <= dVar211 * dVar216) {
                            dVar196 = ABS(dVar216);
                            if (ABS(dVar211) <= ABS(dVar216)) {
                              dVar196 = ABS(dVar211);
                            }
                            dVar196 = dVar196 + dVar196;
                          }
                          dVar192 = (dVar211 + dVar192) * 0.5;
                          dVar211 = ABS(dVar192);
                          if (dVar187 <= dVar211) {
                            dVar211 = dVar187;
                          }
                          dVar187 = ABS(dVar191);
                          if (dVar204 <= dVar187) {
                            dVar187 = dVar204;
                          }
                          dVar187 = ABS(dVar194 * 1.3333333333333333 +
                                        (dVar187 * (double)((ulong)dVar191 & 0x8000000000000000 |
                                                           0x3ff0000000000000) +
                                        dVar211 * (double)((ulong)dVar192 & 0x8000000000000000 |
                                                          0x3ff0000000000000)) *
                                        -0.16666666666666666);
                          if (dVar196 <= dVar187) {
                            dVar187 = dVar196;
                          }
                          dVar187 = dVar187 * (double)((ulong)dVar194 & 0x8000000000000000 |
                                                      0x3ff0000000000000) *
                                    (-1.0 - pdVar35[lVar117 + lVar98 + lVar38 * 2 +
                                                                       (lVar122 - lVar162)] *
                                            dVar186) * 0.5;
                        }
                        dVar187 = dVar187 + dVar190;
LAB_0031ac73:
                        dVar190 = pdVar50[lVar115 + lVar135 + lVar108];
                        if ((((dVar190 != 1.0) || (NAN(dVar190))) ||
                            (pdVar50[lVar115 + lVar135 + ((iVar144 + -3) - iVar15) * lVar52] != 1.0)
                            ) || (NAN(pdVar50[lVar115 + lVar135 + ((iVar144 + -3) - iVar15) * lVar52
                                             ]))) {
                          if (((dVar201 != 1.0) || (NAN(dVar201))) ||
                             ((dVar190 != 1.0 || (NAN(dVar190))))) goto LAB_0031b063;
                        }
                        else {
                          if ((dVar201 != 1.0) || (NAN(dVar201))) {
LAB_0031b063:
                            bVar184 = true;
                            local_918 = 1.0;
                            goto LAB_0031b073;
                          }
                          if ((pdVar50[lVar115 + lVar135 + lVar107] == 1.0) &&
                             (!NAN(pdVar50[lVar115 + lVar135 + lVar107]))) {
                            lVar123 = lVar122 - lVar156;
                            dVar190 = pdVar31[lVar116 + lVar123 + lVar99 + lVar132];
                            dVar211 = dVar190 - pdVar31[lVar116 + lVar123 + lVar133 + lVar132];
                            dVar192 = pdVar31[lVar116 + lVar123 + lVar133 + lVar132] -
                                      pdVar31[lVar116 + lVar123 + ((iVar144 + -3) - iVar4) * lVar33
                                                                  + lVar132];
                            dVar204 = 0.0;
                            dVar201 = 0.0;
                            if (0.0 <= dVar211 * dVar192) {
                              dVar201 = ABS(dVar211);
                              if (ABS(dVar192) <= ABS(dVar211)) {
                                dVar201 = ABS(dVar192);
                              }
                              dVar201 = dVar201 + dVar201;
                            }
                            dVar191 = pdVar31[lVar116 + lVar123 + (iVar154 - iVar4) * lVar33 +
                                                                  lVar132] -
                                      pdVar31[lVar116 + lVar123 + lVar97 + lVar132];
                            dVar216 = pdVar31[lVar116 + lVar123 + lVar97 + lVar132] - dVar190;
                            dVar196 = (dVar216 + dVar191) * 0.5;
                            if (0.0 <= dVar216 * dVar191) {
                              dVar204 = ABS(dVar191);
                              if (ABS(dVar216) <= ABS(dVar191)) {
                                dVar204 = ABS(dVar216);
                              }
                              dVar204 = dVar204 + dVar204;
                            }
                            dVar194 = (dVar211 + dVar216) * 0.5;
                            dVar191 = 0.0;
                            if (0.0 <= dVar211 * dVar216) {
                              dVar191 = ABS(dVar216);
                              if (ABS(dVar211) <= ABS(dVar216)) {
                                dVar191 = ABS(dVar211);
                              }
                              dVar191 = dVar191 + dVar191;
                            }
                            dVar192 = (dVar211 + dVar192) * 0.5;
                            dVar211 = ABS(dVar192);
                            if (dVar201 <= dVar211) {
                              dVar211 = dVar201;
                            }
                            dVar201 = ABS(dVar196);
                            if (dVar204 <= dVar201) {
                              dVar201 = dVar204;
                            }
                            dVar201 = ABS(dVar194 * 1.3333333333333333 +
                                          (dVar201 * (double)((ulong)dVar196 & 0x8000000000000000 |
                                                             0x3ff0000000000000) +
                                          dVar211 * (double)((ulong)dVar192 & 0x8000000000000000 |
                                                            0x3ff0000000000000)) *
                                          -0.16666666666666666);
                            if (dVar191 <= dVar201) {
                              dVar201 = dVar191;
                            }
                            dVar190 = dVar201 * (double)((ulong)dVar194 & 0x8000000000000000 |
                                                        0x3ff0000000000000) *
                                      (1.0 - pdVar35[lVar117 + lVar152 + lVar38 * 2 +
                                                                         (lVar122 - lVar162)] *
                                             dVar186) * 0.5 + dVar190;
                            goto LAB_0031c47c;
                          }
                        }
                        lVar123 = lVar122 - lVar156;
                        dVar190 = pdVar31[lVar116 + lVar123 + lVar99 + lVar132];
                        dVar211 = dVar190 - pdVar31[lVar116 + lVar123 + lVar133 + lVar132];
                        dVar192 = pdVar31[lVar116 + lVar123 + lVar97 + lVar132] - dVar190;
                        dVar211 = dVar211 + dVar211;
                        dVar192 = dVar192 + dVar192;
                        dVar201 = (pdVar31[lVar116 + lVar123 + lVar97 + lVar132] -
                                  pdVar31[lVar116 + lVar123 + lVar133 + lVar132]) * 0.5;
                        dVar191 = ABS(dVar211);
                        uVar185 = -(ulong)(0.0 < dVar201);
                        dVar201 = ABS(dVar201);
                        dVar204 = ABS(dVar192);
                        if (dVar191 <= dVar201) {
                          dVar201 = dVar191;
                        }
                        if (dVar201 <= dVar204) {
                          dVar204 = dVar201;
                        }
                        uVar189 = -(ulong)(0.0 < dVar211 * dVar192) & (ulong)dVar204;
                        dVar190 = (double)(~uVar185 & (uVar189 ^ 0x8000000000000000) |
                                          uVar185 & uVar189) *
                                  (1.0 - pdVar35[lVar117 + lVar152 + lVar38 * 2 +
                                                                     (lVar122 - lVar162)] * dVar186)
                                  * 0.5 + dVar190;
                      }
                    }
LAB_0031c47c:
                    pdVar43[local_8a8 * lVar46 +
                            (int)(~uVar11 + iVar144) * lVar45 +
                            (lVar183 - iVar10) * lVar44 + (lVar122 - iVar9)] = dVar190;
                    pdVar39[local_8a8 * lVar42 +
                            (lVar128 - iVar8) * lVar41 +
                            (lVar183 - iVar7) * lVar40 + (lVar122 - iVar6)] = dVar187;
                    lVar122 = lVar122 + 1;
                    local_748 = local_748 + 1;
                    pdVar165 = pdVar165 + 1;
                    local_750 = local_750 + 1;
                    iVar140 = iVar140 + 1;
                    iVar80 = iVar80 + 1;
                    lVar134 = lVar134 + 8;
                  } while (iVar25 + 1 != (int)lVar122);
                }
                lVar183 = lVar183 + 1;
              } while ((int)uVar113 != iVar26 + 1);
            }
            lVar128 = lVar128 + 1;
          } while (iVar27 + 1 != (int)lVar128);
        }
        local_8a8 = local_8a8 + 1;
        local_830 = local_830 + lVar34;
        if (local_8a8 == 3) {
          return;
        }
      } while( true );
    }
  }
  else {
    iVar6 = (zebox->bigend).vect[0];
  }
  local_2d8.q.p = q->p;
  local_2d8.q.jstride = q->jstride;
  local_2d8.q.kstride = q->kstride;
  local_2d8.q.nstride = q->nstride;
  local_2d8.q.begin.x = (q->begin).x;
  local_2d8.q.begin.y = (q->begin).y;
  uVar67 = *(undefined8 *)&(q->begin).z;
  uVar68 = (q->end).y;
  local_2d8.q._52_8_ = *(undefined8 *)&(q->end).z;
  local_2d8.q.begin.z = (int)uVar67;
  local_2d8.q.end.x = (int)((ulong)uVar67 >> 0x20);
  local_2d8.ccvel.p = ccvel->p;
  local_2d8.ccvel.jstride = ccvel->jstride;
  local_2d8.ccvel.kstride = ccvel->kstride;
  local_2d8.ccvel.nstride = ccvel->nstride;
  local_2d8.ccvel.begin.x = (ccvel->begin).x;
  local_2d8.ccvel.begin.y = (ccvel->begin).y;
  uVar69 = (ccvel->end).x;
  uVar70 = (ccvel->end).y;
  local_2d8.ccvel._52_8_ = *(undefined8 *)&(ccvel->end).z;
  local_2d8.ccvel.begin.z = (int)*(undefined8 *)&(ccvel->begin).z;
  local_2d8.Imz.p = Imz->p;
  local_2d8.Imz.jstride = Imz->jstride;
  local_2d8.Imz.kstride = Imz->kstride;
  local_2d8.Imz.nstride = Imz->nstride;
  local_2d8.Imz.begin.x = (Imz->begin).x;
  local_2d8.Imz.begin.y = (Imz->begin).y;
  uVar67 = *(undefined8 *)&(Imz->begin).z;
  uVar71 = (Imz->end).y;
  local_2d8.Imz._52_8_ = *(undefined8 *)&(Imz->end).z;
  local_2d8.Imz.begin.z = (int)uVar67;
  local_2d8.Imz.end.x = (int)((ulong)uVar67 >> 0x20);
  local_2d8.Ipz.p = Ipz->p;
  local_2d8.Ipz.jstride = Ipz->jstride;
  local_2d8.Ipz.kstride = Ipz->kstride;
  local_2d8.Ipz.nstride = Ipz->nstride;
  local_2d8.Ipz.begin.x = (Ipz->begin).x;
  local_2d8.Ipz.begin.y = (Ipz->begin).y;
  uVar72 = (Ipz->end).x;
  uVar73 = (Ipz->end).y;
  local_2d8.Ipz._52_8_ = *(undefined8 *)&(Ipz->end).z;
  local_2d8.Ipz.begin.z = (int)*(undefined8 *)&(Ipz->begin).z;
  local_2d8.pbc = pbc;
  local_2d8.flag.p = flag->p;
  local_2d8.flag.jstride = flag->jstride;
  local_2d8.flag.kstride = flag->kstride;
  local_2d8.flag.nstride = flag->nstride;
  local_2d8.flag.begin.x = (flag->begin).x;
  local_2d8.flag.begin.y = (flag->begin).y;
  uVar67 = *(undefined8 *)&(flag->begin).z;
  uVar74 = (flag->end).y;
  local_2d8.flag._52_8_ = *(undefined8 *)&(flag->end).z;
  local_2d8.flag.begin.z = (int)uVar67;
  local_2d8.flag.end.x = (int)((ulong)uVar67 >> 0x20);
  local_2d8.vfrac.p = vfrac->p;
  local_2d8.vfrac.jstride = vfrac->jstride;
  local_2d8.vfrac.kstride = vfrac->kstride;
  local_2d8.vfrac.nstride = vfrac->nstride;
  local_2d8.vfrac.begin.x = (vfrac->begin).x;
  local_2d8.vfrac.begin.y = (vfrac->begin).y;
  uVar67 = *(undefined8 *)&(vfrac->begin).z;
  uVar75 = (vfrac->end).y;
  local_2d8.vfrac._52_8_ = *(undefined8 *)&(vfrac->end).z;
  local_2d8.vfrac.begin.z = (int)uVar67;
  local_2d8.vfrac.end.x = (int)((ulong)uVar67 >> 0x20);
  local_2d8.ccc.p = ccc->p;
  local_2d8.ccc.jstride = ccc->jstride;
  local_2d8.ccc.kstride = ccc->kstride;
  local_2d8.ccc.nstride = ccc->nstride;
  local_2d8.ccc.begin.x = (ccc->begin).x;
  local_2d8.ccc.begin.y = (ccc->begin).y;
  uVar67 = *(undefined8 *)&(ccc->begin).z;
  uVar76 = (ccc->end).y;
  local_2d8.ccc._52_8_ = *(undefined8 *)&(ccc->end).z;
  local_2d8.ccc.begin.z = (int)uVar67;
  local_2d8.ccc.end.x = (int)((ulong)uVar67 >> 0x20);
  local_2d8.fcx.p = fcx->p;
  local_2d8.fcx.jstride = fcx->jstride;
  local_2d8.fcx.kstride = fcx->kstride;
  local_2d8.fcx.nstride = fcx->nstride;
  local_2d8.fcx.begin.x = (fcx->begin).x;
  local_2d8.fcx.begin.y = (fcx->begin).y;
  uVar67 = *(undefined8 *)&(fcx->begin).z;
  uVar77 = (fcx->end).y;
  local_2d8.fcx._52_8_ = *(undefined8 *)&(fcx->end).z;
  local_2d8.fcx.begin.z = (int)uVar67;
  local_2d8.fcx.end.x = (int)((ulong)uVar67 >> 0x20);
  local_2d8.fcy.p = fcy->p;
  local_2d8.fcy.jstride = fcy->jstride;
  local_2d8.fcy.kstride = fcy->kstride;
  local_2d8.fcy.nstride = fcy->nstride;
  local_2d8.fcy.begin.x = (fcy->begin).x;
  local_2d8.fcy.begin.y = (fcy->begin).y;
  uVar67 = *(undefined8 *)&(fcy->begin).z;
  uVar78 = (fcy->end).y;
  local_2d8.fcy._52_8_ = *(undefined8 *)&(fcy->end).z;
  local_2d8.fcy.begin.z = (int)uVar67;
  local_2d8.fcy.end.x = (int)((ulong)uVar67 >> 0x20);
  local_2d8.fcz.p = fcz->p;
  local_2d8.fcz.jstride = fcz->jstride;
  local_2d8.fcz.kstride = fcz->kstride;
  local_2d8.fcz.nstride = fcz->nstride;
  local_2d8.fcz.begin.x = (fcz->begin).x;
  local_2d8.fcz.begin.y = (fcz->begin).y;
  uVar67 = *(undefined8 *)&(fcz->begin).z;
  uVar79 = (fcz->end).y;
  local_2d8.fcz._52_8_ = *(undefined8 *)&(fcz->end).z;
  local_2d8.fcz.begin.z = (int)uVar67;
  local_2d8.fcz.end.x = (int)((ulong)uVar67 >> 0x20);
  iVar7 = (zebox->smallend).vect[0];
  iVar8 = (zebox->smallend).vect[1];
  iVar9 = (zebox->smallend).vect[2];
  iVar10 = (zebox->bigend).vect[1];
  iVar12 = (zebox->bigend).vect[2];
  iVar141 = 0;
  local_2d8.q.end.y = uVar68;
  local_2d8.ccvel.end.x = uVar69;
  local_2d8.ccvel.end.y = uVar70;
  local_2d8.domain_ilo = iVar175;
  local_2d8.domain_jlo = iVar181;
  local_2d8.domain_klo = iVar4;
  local_2d8.domain_ihi = iVar168;
  local_2d8.domain_jhi = iVar3;
  local_2d8.domain_khi = iVar5;
  local_2d8.Imz.end.y = uVar71;
  local_2d8.Ipz.end.x = uVar72;
  local_2d8.Ipz.end.y = uVar73;
  local_2d8.dtdz = dVar186;
  local_2d8.flag.end.y = uVar74;
  local_2d8.vfrac.end.y = uVar75;
  local_2d8.ccc.end.y = uVar76;
  local_2d8.fcx.end.y = uVar77;
  local_2d8.fcy.end.y = uVar78;
  local_2d8.fcz.end.y = uVar79;
  do {
    iVar175 = iVar9;
    if (iVar9 <= iVar12) {
      do {
        iVar181 = iVar8;
        if (iVar8 <= iVar10) {
          do {
            iVar168 = iVar7;
            if (iVar7 <= iVar6) {
              do {
                PredictVelOnZFace::anon_class_680_18_41abcaaf::operator()
                          (&local_2d8,iVar168,iVar181,iVar175,iVar141);
                iVar168 = iVar168 + 1;
              } while (iVar6 + 1 != iVar168);
            }
            bVar184 = iVar181 != iVar10;
            iVar181 = iVar181 + 1;
          } while (bVar184);
        }
        bVar184 = iVar175 != iVar12;
        iVar175 = iVar175 + 1;
      } while (bVar184);
    }
    iVar141 = iVar141 + 1;
  } while (iVar141 != 3);
  return;
}

Assistant:

void
EBPLM::PredictVelOnZFace (Box const& zebox,
                          Array4<Real> const& Imz, Array4<Real> const& Ipz,
                          Array4<Real const> const& q,
                          Array4<Real const> const& ccvel,
                          Array4<EBCellFlag const> const& flag,
                          Array4<Real const> const& vfrac,
                          AMREX_D_DECL(Array4<Real const> const& fcx,
                                       Array4<Real const> const& fcy,
                                       Array4<Real const> const& fcz),
                          Array4<Real const> const& ccc,
                          Geometry& geom,
                          Real dt,
                          Vector<BCRec> const& h_bcrec,
                          BCRec const* pbc)
{
    const Real dz = geom.CellSize(2);
    const Real dtdz = dt/dz;

    int ncomp = AMREX_SPACEDIM;

    const Box& domain_box = geom.Domain();
    const int domain_ilo = domain_box.smallEnd(0);
    const int domain_ihi = domain_box.bigEnd(0);
    const int domain_jlo = domain_box.smallEnd(1);
    const int domain_jhi = domain_box.bigEnd(1);
    const int domain_klo = domain_box.smallEnd(2);
    const int domain_khi = domain_box.bigEnd(2);

    // At an ext_dir boundary, the boundary value is on the face, not cell center.
    auto extdir_lohi_x = has_extdir_or_ho(h_bcrec.data(), AMREX_SPACEDIM, static_cast<int>(Direction::x));
    auto extdir_lohi_y = has_extdir_or_ho(h_bcrec.data(), AMREX_SPACEDIM, static_cast<int>(Direction::y));
    auto extdir_lohi_z = has_extdir_or_ho(h_bcrec.data(), AMREX_SPACEDIM, static_cast<int>(Direction::z));

    bool has_extdir_or_ho_lo_x = extdir_lohi_x.first;
    bool has_extdir_or_ho_hi_x = extdir_lohi_x.second;
    bool has_extdir_or_ho_lo_y = extdir_lohi_y.first;
    bool has_extdir_or_ho_hi_y = extdir_lohi_y.second;
    bool has_extdir_or_ho_lo_z = extdir_lohi_z.first;
    bool has_extdir_or_ho_hi_z = extdir_lohi_z.second;

    if ( (has_extdir_or_ho_lo_x && domain_ilo >= zebox.smallEnd(0)-1) ||
         (has_extdir_or_ho_hi_x && domain_ihi <= zebox.bigEnd(0)    ) ||
         (has_extdir_or_ho_lo_z && domain_klo >= zebox.smallEnd(2)-1) ||
         (has_extdir_or_ho_hi_z && domain_khi <= zebox.bigEnd(2)    ) ||
         (has_extdir_or_ho_lo_y && domain_jlo >= zebox.smallEnd(1)-1) ||
         (has_extdir_or_ho_hi_y && domain_jhi <= zebox.bigEnd(1)    ) )
    {
        amrex::ParallelFor(zebox, ncomp, [q,ccvel,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                                  AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imz,Ipz,dtdz,pbc,flag,vfrac,ccc,AMREX_D_DECL(fcx,fcy,fcz)]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apz(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(0,0,-1))
            {
                const auto& bc = pbc[n];
                bool extdir_or_ho_ilo = (bc.lo(0) == BCType::ext_dir) ||
                                        (bc.lo(0) == BCType::hoextrap);
                bool extdir_or_ho_ihi = (bc.hi(0) == BCType::ext_dir) ||
                                        (bc.hi(0) == BCType::hoextrap);
                bool extdir_or_ho_jlo = (bc.lo(1) == BCType::ext_dir) ||
                                        (bc.lo(1) == BCType::hoextrap);
                bool extdir_or_ho_jhi = (bc.hi(1) == BCType::ext_dir) ||
                                        (bc.hi(1) == BCType::hoextrap);
                bool extdir_or_ho_klo = (bc.lo(2) == BCType::ext_dir) ||
                                        (bc.lo(2) == BCType::hoextrap);
                bool extdir_or_ho_khi = (bc.hi(2) == BCType::ext_dir) ||
                                        (bc.hi(2) == BCType::hoextrap);

                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. &&
                                           vfrac(i,j,k+1) == 1. && vfrac(i,j,k+2) == 1.)
                {
                    int order = 4;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - ccvel(i,j,k,2) * dtdz) *
                        amrex_calc_zslope_extdir(i,j,k,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i,j,k-1) == 1. && vfrac(i,j,k+1) == 1.) {

                    int order = 2;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - ccvel(i,j,k,2) * dtdz) *
                        amrex_calc_zslope_extdir(i,j,k,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);

                // We need to use LS slopes
                } else {

                   Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
                   Real yf = fcz(i,j,k,1);

                   AMREX_D_TERM(Real delta_z = -0.5 - ccc(i,j,k,2);,
                                Real delta_x =  xf  - ccc(i,j,k,0);,
                                Real delta_y =  yf  - ccc(i,j,k,1););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j,k-1,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j,k-1,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_hi = amrex_lim_slopes_extdir_eb(i,j,k,n,q,ccc,vfrac,
                                              AMREX_D_DECL(fcx,fcy,fcz), flag,
                                              AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                              AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                              AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                              AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                              max_order);

                   qpls = q(i,j,k,n) + delta_z * slopes_eb_hi[2]
                                     + delta_x * slopes_eb_hi[0]
                                     + delta_y * slopes_eb_hi[1];

                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);
                   qpls -= 0.5 * dtdz * ccvel(i,j,k,2) * slopes_eb_hi[2];


                }  // end of making qpls

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j-1,k) with all values at cell centers
                if (vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. && vfrac(i,j,k-3) == 1. &&
                                             vfrac(i,j,k  ) == 1. && vfrac(i,j,k+1) == 1.)
                {
                    int order = 4;
                    qmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - ccvel(i,j,k-1,2) * dtdz) *
                        amrex_calc_zslope_extdir(i,j,k-1,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. && vfrac(i,j,k  ) == 1.)
                {
                    int order = 2;
                    qmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - ccvel(i,j,k-1,2) * dtdz) *
                        amrex_calc_zslope_extdir(i,j,k-1,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);

                // We need to use LS slopes
                } else {

                   Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
                   Real yf = fcz(i,j,k,1);

                   AMREX_D_TERM(Real delta_z = 0.5 - ccc(i,j,k-1,2);,
                                Real delta_x = xf  - ccc(i,j,k-1,0);,
                                Real delta_y = yf  - ccc(i,j,k-1,1););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j,k-1,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j,k-1,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_lo = amrex_lim_slopes_extdir_eb(i,j,k-1,n,q,ccc,vfrac,
                                              AMREX_D_DECL(fcx,fcy,fcz), flag,
                                              AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                              AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                              AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                              AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                              max_order);

                   qmns = q(i,j,k-1,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];

                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);
                   qmns -= 0.5 * dtdz * ccvel(i,j,k-1,2) * slopes_eb_lo[2];

                }  // end of making qmns
            }

            Ipz(i,j,k-1,n) = qmns;
            Imz(i,j,k  ,n) = qpls;
        });
    }
    else // The cases below are not near any domain boundary
    {
        amrex::ParallelFor(zebox, ncomp, [q,ccvel,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                          AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imz,Ipz,dtdz,pbc,flag,vfrac,ccc,AMREX_D_DECL(fcx,fcy,fcz)]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apx(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(0,0,-1))
            {
                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. &&
                                           vfrac(i,j,k+1) == 1. && vfrac(i,j,k+2) == 1.)
                {
                    int order = 4;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - ccvel(i,j,k,2) * dtdz) *
                        amrex_calc_zslope(i,j,k,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i,j,k-1) == 1. && vfrac(i,j,k+1) == 1.) {

                    int order = 2;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - ccvel(i,j,k,2) * dtdz) *
                        amrex_calc_zslope(i,j,k,n,order,q);

                // We need to use LS slopes
                } else {

                   Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
                   Real yf = fcz(i,j,k,1);

                   AMREX_D_TERM(Real delta_z = -0.5 - ccc(i,j,k,2);,
                                Real delta_x =  xf  - ccc(i,j,k,0);,
                                Real delta_y =  yf  - ccc(i,j,k,1););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j,k-1,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j,k-1,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_hi = amrex_lim_slopes_eb(i,j,k,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

                   qpls = q(i,j,k,n) + delta_x * slopes_eb_hi[0]
                                     + delta_y * slopes_eb_hi[1]
                                     + delta_z * slopes_eb_hi[2];

                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);

                   qpls -= 0.5 * dtdz * ccvel(i,j,k,2) * slopes_eb_hi[2];

                }  // end of making qpls

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k-1) with all values at cell centers
                if (vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. && vfrac(i,j,k-3) == 1. &&
                                             vfrac(i,j,k  ) == 1. && vfrac(i,j,k+1) == 1.)
                {
                    int order = 4;
                    qmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - ccvel(i,j,k-1,2) * dtdz) *
                        amrex_calc_zslope(i,j,k-1,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. && vfrac(i,j,k  ) == 1.)
                {
                    int order = 2;
                    qmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - ccvel(i,j,k-1,2) * dtdz) *
                        amrex_calc_zslope(i,j,k-1,n,order,q);

                // We need to use LS slopes
                } else {

                   Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
                   Real yf = fcz(i,j,k,1);

                   AMREX_D_TERM(Real delta_z = 0.5 - ccc(i,j,k-1,2);,
                                Real delta_x = xf  - ccc(i,j,k-1,0);,
                                Real delta_y = yf  - ccc(i,j,k-1,1););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j,k-1,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j,k-1,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_lo = amrex_lim_slopes_eb(i,j,k-1,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

                   qmns = q(i,j,k-1,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];

                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);

                   qmns -= 0.5 * dtdz * ccvel(i,j,k-1,2) * slopes_eb_lo[2];

                }  // end of making qmns
            }

            Ipz(i,j,k-1,n) = qmns;
            Imz(i,j,k  ,n) = qpls;
        });
    }
}